

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

void embree::avx2::CurveNiMBIntersector1<8>::
     intersect_t<embree::avx2::RibbonCurve1Intersector1<embree::BSplineCurveT,8>,embree::avx2::Intersect1EpilogMU<8,true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  undefined1 (*pauVar2) [32];
  float *pfVar3;
  undefined8 uVar4;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  Primitive PVar15;
  uint uVar16;
  int iVar17;
  __int_type_conflict _Var18;
  long lVar19;
  RTCFilterFunctionN p_Var20;
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  long lVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  bool bVar90;
  undefined1 auVar91 [32];
  bool bVar92;
  undefined1 auVar93 [32];
  bool bVar94;
  bool bVar95;
  bool bVar96;
  bool bVar97;
  bool bVar98;
  bool bVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [28];
  uint uVar115;
  uint uVar116;
  uint uVar117;
  ulong uVar118;
  uint uVar119;
  long lVar120;
  long lVar121;
  undefined1 auVar122 [8];
  Geometry *pGVar123;
  ulong uVar124;
  undefined4 uVar125;
  undefined8 uVar126;
  float fVar141;
  undefined1 auVar127 [16];
  float fVar140;
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  float fVar143;
  float fVar144;
  float fVar145;
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  float fVar142;
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  float fVar161;
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  float fVar162;
  float fVar163;
  float fVar182;
  undefined1 auVar164 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar177 [32];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [64];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [64];
  undefined4 uVar212;
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [64];
  undefined1 auVar219 [16];
  undefined1 auVar220 [32];
  undefined1 in_ZMM10 [64];
  undefined1 auVar221 [32];
  undefined1 auVar222 [64];
  float fVar223;
  float fVar224;
  float fVar228;
  undefined1 auVar225 [16];
  undefined8 uVar229;
  undefined8 uVar230;
  undefined8 uVar231;
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar235 [64];
  undefined1 auVar234 [32];
  undefined1 auVar236 [64];
  float fVar237;
  float fVar239;
  float fVar240;
  float fVar241;
  float fVar242;
  float fVar243;
  float fVar244;
  float fVar245;
  float fVar246;
  float fVar247;
  float fVar248;
  undefined1 auVar238 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [64];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  RibbonHit<embree::BSplineCurveT<embree::Vec3fx>,_8> bhit;
  int local_82c;
  ulong local_828;
  undefined1 local_820 [8];
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  undefined1 local_800 [32];
  ulong local_7d8;
  undefined1 local_7d0 [16];
  Precalculations *local_7b8;
  RTCFilterFunctionNArguments local_7b0;
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  float local_6e0;
  float fStack_6dc;
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  float fStack_6c4;
  undefined1 local_6c0 [8];
  undefined8 uStack_6b8;
  undefined1 local_6b0 [16];
  undefined1 local_6a0 [16];
  undefined8 local_690;
  undefined4 local_688;
  float local_684;
  undefined4 local_680;
  undefined4 local_67c;
  undefined4 local_678;
  uint local_674;
  uint local_670;
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  undefined1 local_600 [32];
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  Primitive *local_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  int local_3a0;
  int local_39c;
  undefined8 local_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined1 local_340 [32];
  float local_320 [4];
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined1 local_220 [32];
  undefined4 local_1f0;
  undefined4 uStack_1ec;
  undefined4 uStack_1e8;
  undefined4 uStack_1e4;
  undefined1 local_1e0 [32];
  float local_1c0;
  float fStack_1bc;
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  undefined4 local_1a0;
  undefined4 uStack_19c;
  undefined4 uStack_198;
  undefined4 uStack_194;
  undefined4 uStack_190;
  undefined4 uStack_18c;
  undefined4 uStack_188;
  undefined4 uStack_184;
  undefined4 local_180;
  undefined4 uStack_17c;
  undefined4 uStack_178;
  undefined4 uStack_174;
  undefined4 uStack_170;
  undefined4 uStack_16c;
  undefined4 uStack_168;
  undefined4 uStack_164;
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  local_7b8 = pre;
  PVar15 = prim[1];
  uVar118 = (ulong)(byte)PVar15;
  lVar25 = uVar118 * 0x25;
  fVar163 = *(float *)(prim + lVar25 + 0x12);
  auVar191 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                        *(undefined1 (*) [16])(prim + lVar25 + 6));
  auVar164._0_4_ = fVar163 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar164._4_4_ = fVar163 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar164._8_4_ = fVar163 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar164._12_4_ = fVar163 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar127._0_4_ = fVar163 * auVar191._0_4_;
  auVar127._4_4_ = fVar163 * auVar191._4_4_;
  auVar127._8_4_ = fVar163 * auVar191._8_4_;
  auVar127._12_4_ = fVar163 * auVar191._12_4_;
  auVar191._8_8_ = 0;
  auVar191._0_8_ = *(ulong *)(prim + uVar118 * 4 + 6);
  auVar146 = vpmovsxbd_avx2(auVar191);
  auVar146 = vcvtdq2ps_avx(auVar146);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar118 * 5 + 6);
  auVar137 = vpmovsxbd_avx2(auVar8);
  auVar137 = vcvtdq2ps_avx(auVar137);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar118 * 6 + 6);
  auVar135 = vpmovsxbd_avx2(auVar9);
  auVar135 = vcvtdq2ps_avx(auVar135);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar118 * 0xf + 6);
  auVar153 = vpmovsxbd_avx2(auVar10);
  auVar153 = vcvtdq2ps_avx(auVar153);
  auVar129._8_8_ = 0;
  auVar129._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar15 * 0x10 + 6);
  auVar22 = vpmovsxbd_avx2(auVar129);
  auVar22 = vcvtdq2ps_avx(auVar22);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar15 * 0x10 + uVar118 + 6);
  auVar179 = vpmovsxbd_avx2(auVar11);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar118 * 0x1a + 6);
  auVar23 = vpmovsxbd_avx2(auVar12);
  auVar179 = vcvtdq2ps_avx(auVar179);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar118 * 0x1b + 6);
  auVar156 = vpmovsxbd_avx2(auVar13);
  auVar23 = vcvtdq2ps_avx(auVar23);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar118 * 0x1c + 6);
  auVar24 = vpmovsxbd_avx2(auVar14);
  auVar203 = vcvtdq2ps_avx(auVar156);
  auVar24 = vcvtdq2ps_avx(auVar24);
  auVar232._4_4_ = auVar164._0_4_;
  auVar232._0_4_ = auVar164._0_4_;
  auVar232._8_4_ = auVar164._0_4_;
  auVar232._12_4_ = auVar164._0_4_;
  auVar232._16_4_ = auVar164._0_4_;
  auVar232._20_4_ = auVar164._0_4_;
  auVar232._24_4_ = auVar164._0_4_;
  auVar232._28_4_ = auVar164._0_4_;
  auVar191 = vmovshdup_avx(auVar164);
  uVar126 = auVar191._0_8_;
  auVar249._8_8_ = uVar126;
  auVar249._0_8_ = uVar126;
  auVar249._16_8_ = uVar126;
  auVar249._24_8_ = uVar126;
  auVar191 = vshufps_avx(auVar164,auVar164,0xaa);
  fVar163 = auVar191._0_4_;
  auVar235._0_4_ = fVar163 * auVar135._0_4_;
  fVar140 = auVar191._4_4_;
  auVar235._4_4_ = fVar140 * auVar135._4_4_;
  auVar235._8_4_ = fVar163 * auVar135._8_4_;
  auVar235._12_4_ = fVar140 * auVar135._12_4_;
  auVar235._16_4_ = fVar163 * auVar135._16_4_;
  auVar235._20_4_ = fVar140 * auVar135._20_4_;
  auVar235._28_36_ = in_ZMM10._28_36_;
  auVar235._24_4_ = fVar163 * auVar135._24_4_;
  auVar148._4_4_ = auVar179._4_4_ * fVar140;
  auVar148._0_4_ = auVar179._0_4_ * fVar163;
  auVar148._8_4_ = auVar179._8_4_ * fVar163;
  auVar148._12_4_ = auVar179._12_4_ * fVar140;
  auVar148._16_4_ = auVar179._16_4_ * fVar163;
  auVar148._20_4_ = auVar179._20_4_ * fVar140;
  auVar148._24_4_ = auVar179._24_4_ * fVar163;
  auVar148._28_4_ = auVar156._28_4_;
  auVar207._0_4_ = auVar24._0_4_ * fVar163;
  auVar207._4_4_ = auVar24._4_4_ * fVar140;
  auVar207._8_4_ = auVar24._8_4_ * fVar163;
  auVar207._12_4_ = auVar24._12_4_ * fVar140;
  auVar207._16_4_ = auVar24._16_4_ * fVar163;
  auVar207._20_4_ = auVar24._20_4_ * fVar140;
  auVar207._24_4_ = auVar24._24_4_ * fVar163;
  auVar207._28_4_ = 0;
  auVar191 = vfmadd231ps_fma(auVar235._0_32_,auVar249,auVar137);
  auVar8 = vfmadd231ps_fma(auVar148,auVar249,auVar22);
  auVar9 = vfmadd231ps_fma(auVar207,auVar203,auVar249);
  auVar10 = vfmadd231ps_fma(ZEXT1632(auVar191),auVar232,auVar146);
  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar232,auVar153);
  auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar23,auVar232);
  auVar233._4_4_ = auVar127._0_4_;
  auVar233._0_4_ = auVar127._0_4_;
  auVar233._8_4_ = auVar127._0_4_;
  auVar233._12_4_ = auVar127._0_4_;
  auVar233._16_4_ = auVar127._0_4_;
  auVar233._20_4_ = auVar127._0_4_;
  auVar233._24_4_ = auVar127._0_4_;
  auVar233._28_4_ = auVar127._0_4_;
  auVar191 = vmovshdup_avx(auVar127);
  uVar126 = auVar191._0_8_;
  auVar250._8_8_ = uVar126;
  auVar250._0_8_ = uVar126;
  auVar250._16_8_ = uVar126;
  auVar250._24_8_ = uVar126;
  auVar191 = vshufps_avx(auVar127,auVar127,0xaa);
  fVar163 = auVar191._0_4_;
  auVar175._0_4_ = fVar163 * auVar135._0_4_;
  fVar140 = auVar191._4_4_;
  auVar175._4_4_ = fVar140 * auVar135._4_4_;
  auVar175._8_4_ = fVar163 * auVar135._8_4_;
  auVar175._12_4_ = fVar140 * auVar135._12_4_;
  auVar175._16_4_ = fVar163 * auVar135._16_4_;
  auVar175._20_4_ = fVar140 * auVar135._20_4_;
  auVar175._24_4_ = fVar163 * auVar135._24_4_;
  auVar175._28_4_ = 0;
  auVar156._4_4_ = auVar179._4_4_ * fVar140;
  auVar156._0_4_ = auVar179._0_4_ * fVar163;
  auVar156._8_4_ = auVar179._8_4_ * fVar163;
  auVar156._12_4_ = auVar179._12_4_ * fVar140;
  auVar156._16_4_ = auVar179._16_4_ * fVar163;
  auVar156._20_4_ = auVar179._20_4_ * fVar140;
  auVar156._24_4_ = auVar179._24_4_ * fVar163;
  auVar156._28_4_ = auVar135._28_4_;
  auVar135._4_4_ = auVar24._4_4_ * fVar140;
  auVar135._0_4_ = auVar24._0_4_ * fVar163;
  auVar135._8_4_ = auVar24._8_4_ * fVar163;
  auVar135._12_4_ = auVar24._12_4_ * fVar140;
  auVar135._16_4_ = auVar24._16_4_ * fVar163;
  auVar135._20_4_ = auVar24._20_4_ * fVar140;
  auVar135._24_4_ = auVar24._24_4_ * fVar163;
  auVar135._28_4_ = fVar140;
  auVar191 = vfmadd231ps_fma(auVar175,auVar250,auVar137);
  auVar129 = vfmadd231ps_fma(auVar156,auVar250,auVar22);
  auVar11 = vfmadd231ps_fma(auVar135,auVar250,auVar203);
  auVar127 = vfmadd231ps_fma(ZEXT1632(auVar191),auVar233,auVar146);
  local_1e0._8_4_ = 0x7fffffff;
  local_1e0._0_8_ = 0x7fffffff7fffffff;
  local_1e0._12_4_ = 0x7fffffff;
  local_1e0._16_4_ = 0x7fffffff;
  local_1e0._20_4_ = 0x7fffffff;
  local_1e0._24_4_ = 0x7fffffff;
  local_1e0._28_4_ = 0x7fffffff;
  auVar185._8_4_ = 0x219392ef;
  auVar185._0_8_ = 0x219392ef219392ef;
  auVar185._12_4_ = 0x219392ef;
  auVar185._16_4_ = 0x219392ef;
  auVar185._20_4_ = 0x219392ef;
  auVar185._24_4_ = 0x219392ef;
  auVar185._28_4_ = 0x219392ef;
  auVar146 = vandps_avx(ZEXT1632(auVar10),local_1e0);
  auVar146 = vcmpps_avx(auVar146,auVar185,1);
  auVar137 = vblendvps_avx(ZEXT1632(auVar10),auVar185,auVar146);
  auVar146 = vandps_avx(ZEXT1632(auVar8),local_1e0);
  auVar146 = vcmpps_avx(auVar146,auVar185,1);
  auVar135 = vblendvps_avx(ZEXT1632(auVar8),auVar185,auVar146);
  auVar146 = vandps_avx(ZEXT1632(auVar9),local_1e0);
  auVar146 = vcmpps_avx(auVar146,auVar185,1);
  auVar146 = vblendvps_avx(ZEXT1632(auVar9),auVar185,auVar146);
  auVar164 = vfmadd231ps_fma(ZEXT1632(auVar129),auVar233,auVar153);
  auVar153 = vrcpps_avx(auVar137);
  auVar26 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar233,auVar23);
  auVar208._8_4_ = 0x3f800000;
  auVar208._0_8_ = &DAT_3f8000003f800000;
  auVar208._12_4_ = 0x3f800000;
  auVar208._16_4_ = 0x3f800000;
  auVar208._20_4_ = 0x3f800000;
  auVar208._24_4_ = 0x3f800000;
  auVar208._28_4_ = 0x3f800000;
  auVar191 = vfnmadd213ps_fma(auVar137,auVar153,auVar208);
  auVar191 = vfmadd132ps_fma(ZEXT1632(auVar191),auVar153,auVar153);
  auVar137 = vrcpps_avx(auVar135);
  auVar8 = vfnmadd213ps_fma(auVar135,auVar137,auVar208);
  auVar135 = vrcpps_avx(auVar146);
  auVar8 = vfmadd132ps_fma(ZEXT1632(auVar8),auVar137,auVar137);
  auVar9 = vfnmadd213ps_fma(auVar146,auVar135,auVar208);
  auVar9 = vfmadd132ps_fma(ZEXT1632(auVar9),auVar135,auVar135);
  fVar163 = ((ray->super_RayK<1>).dir.field_0.m128[3] - *(float *)(prim + lVar25 + 0x16)) *
            *(float *)(prim + lVar25 + 0x1a);
  auVar146 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar118 * 7 + 6));
  auVar202._4_4_ = fVar163;
  auVar202._0_4_ = fVar163;
  auVar202._8_4_ = fVar163;
  auVar202._12_4_ = fVar163;
  auVar202._16_4_ = fVar163;
  auVar202._20_4_ = fVar163;
  auVar202._24_4_ = fVar163;
  auVar202._28_4_ = fVar163;
  auVar137 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar118 * 0xb + 6));
  auVar146 = vcvtdq2ps_avx(auVar146);
  auVar137 = vcvtdq2ps_avx(auVar137);
  auVar137 = vsubps_avx(auVar137,auVar146);
  auVar10 = vfmadd213ps_fma(auVar137,auVar202,auVar146);
  auVar146 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar118 * 9 + 6));
  auVar146 = vcvtdq2ps_avx(auVar146);
  auVar137 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar118 * 0xd + 6));
  auVar137 = vcvtdq2ps_avx(auVar137);
  auVar137 = vsubps_avx(auVar137,auVar146);
  auVar129 = vfmadd213ps_fma(auVar137,auVar202,auVar146);
  auVar146 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar118 * 0x12 + 6));
  uVar124 = (ulong)(uint)((int)(uVar118 * 5) << 2);
  auVar137 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar118 * 2 + uVar124 + 6));
  auVar146 = vcvtdq2ps_avx(auVar146);
  auVar137 = vcvtdq2ps_avx(auVar137);
  auVar137 = vsubps_avx(auVar137,auVar146);
  auVar11 = vfmadd213ps_fma(auVar137,auVar202,auVar146);
  auVar146 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar124 + 6));
  auVar137 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar118 * 0x18 + 6));
  auVar146 = vcvtdq2ps_avx(auVar146);
  auVar137 = vcvtdq2ps_avx(auVar137);
  auVar137 = vsubps_avx(auVar137,auVar146);
  auVar12 = vfmadd213ps_fma(auVar137,auVar202,auVar146);
  auVar146 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar118 * 0x1d + 6));
  auVar137 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar118 + (ulong)(byte)PVar15 * 0x20 + 6))
  ;
  auVar146 = vcvtdq2ps_avx(auVar146);
  auVar137 = vcvtdq2ps_avx(auVar137);
  auVar137 = vsubps_avx(auVar137,auVar146);
  auVar13 = vfmadd213ps_fma(auVar137,auVar202,auVar146);
  auVar146 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                             (prim + ((ulong)(byte)PVar15 * 0x20 - uVar118) + 6));
  auVar146 = vcvtdq2ps_avx(auVar146);
  local_528 = prim;
  auVar137 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar118 * 0x23 + 6));
  auVar137 = vcvtdq2ps_avx(auVar137);
  auVar137 = vsubps_avx(auVar137,auVar146);
  auVar14 = vfmadd213ps_fma(auVar137,auVar202,auVar146);
  auVar146 = vsubps_avx(ZEXT1632(auVar10),ZEXT1632(auVar127));
  auVar153._4_4_ = auVar191._4_4_ * auVar146._4_4_;
  auVar153._0_4_ = auVar191._0_4_ * auVar146._0_4_;
  auVar153._8_4_ = auVar191._8_4_ * auVar146._8_4_;
  auVar153._12_4_ = auVar191._12_4_ * auVar146._12_4_;
  auVar153._16_4_ = auVar146._16_4_ * 0.0;
  auVar153._20_4_ = auVar146._20_4_ * 0.0;
  auVar153._24_4_ = auVar146._24_4_ * 0.0;
  auVar153._28_4_ = auVar146._28_4_;
  auVar146 = vsubps_avx(ZEXT1632(auVar129),ZEXT1632(auVar127));
  auVar22._4_4_ = auVar191._4_4_ * auVar146._4_4_;
  auVar22._0_4_ = auVar191._0_4_ * auVar146._0_4_;
  auVar22._8_4_ = auVar191._8_4_ * auVar146._8_4_;
  auVar22._12_4_ = auVar191._12_4_ * auVar146._12_4_;
  auVar22._16_4_ = auVar146._16_4_ * 0.0;
  auVar22._20_4_ = auVar146._20_4_ * 0.0;
  auVar22._24_4_ = auVar146._24_4_ * 0.0;
  auVar22._28_4_ = auVar146._28_4_;
  auVar146 = vsubps_avx(ZEXT1632(auVar11),ZEXT1632(auVar164));
  auVar179._4_4_ = auVar8._4_4_ * auVar146._4_4_;
  auVar179._0_4_ = auVar8._0_4_ * auVar146._0_4_;
  auVar179._8_4_ = auVar8._8_4_ * auVar146._8_4_;
  auVar179._12_4_ = auVar8._12_4_ * auVar146._12_4_;
  auVar179._16_4_ = auVar146._16_4_ * 0.0;
  auVar179._20_4_ = auVar146._20_4_ * 0.0;
  auVar179._24_4_ = auVar146._24_4_ * 0.0;
  auVar179._28_4_ = auVar146._28_4_;
  auVar146 = vsubps_avx(ZEXT1632(auVar12),ZEXT1632(auVar164));
  auVar23._4_4_ = auVar8._4_4_ * auVar146._4_4_;
  auVar23._0_4_ = auVar8._0_4_ * auVar146._0_4_;
  auVar23._8_4_ = auVar8._8_4_ * auVar146._8_4_;
  auVar23._12_4_ = auVar8._12_4_ * auVar146._12_4_;
  auVar23._16_4_ = auVar146._16_4_ * 0.0;
  auVar23._20_4_ = auVar146._20_4_ * 0.0;
  auVar23._24_4_ = auVar146._24_4_ * 0.0;
  auVar23._28_4_ = auVar146._28_4_;
  auVar146 = vsubps_avx(ZEXT1632(auVar13),ZEXT1632(auVar26));
  auVar203._4_4_ = auVar9._4_4_ * auVar146._4_4_;
  auVar203._0_4_ = auVar9._0_4_ * auVar146._0_4_;
  auVar203._8_4_ = auVar9._8_4_ * auVar146._8_4_;
  auVar203._12_4_ = auVar9._12_4_ * auVar146._12_4_;
  auVar203._16_4_ = auVar146._16_4_ * 0.0;
  auVar203._20_4_ = auVar146._20_4_ * 0.0;
  auVar203._24_4_ = auVar146._24_4_ * 0.0;
  auVar203._28_4_ = auVar146._28_4_;
  auVar146 = vsubps_avx(ZEXT1632(auVar14),ZEXT1632(auVar26));
  auVar24._4_4_ = auVar9._4_4_ * auVar146._4_4_;
  auVar24._0_4_ = auVar9._0_4_ * auVar146._0_4_;
  auVar24._8_4_ = auVar9._8_4_ * auVar146._8_4_;
  auVar24._12_4_ = auVar9._12_4_ * auVar146._12_4_;
  auVar24._16_4_ = auVar146._16_4_ * 0.0;
  auVar24._20_4_ = auVar146._20_4_ * 0.0;
  auVar24._24_4_ = auVar146._24_4_ * 0.0;
  auVar24._28_4_ = auVar146._28_4_;
  auVar146 = vpminsd_avx2(auVar153,auVar22);
  auVar137 = vpminsd_avx2(auVar179,auVar23);
  auVar146 = vmaxps_avx(auVar146,auVar137);
  auVar137 = vpminsd_avx2(auVar203,auVar24);
  uVar125 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar209._4_4_ = uVar125;
  auVar209._0_4_ = uVar125;
  auVar209._8_4_ = uVar125;
  auVar209._12_4_ = uVar125;
  auVar209._16_4_ = uVar125;
  auVar209._20_4_ = uVar125;
  auVar209._24_4_ = uVar125;
  auVar209._28_4_ = uVar125;
  auVar137 = vmaxps_avx(auVar137,auVar209);
  auVar146 = vmaxps_avx(auVar146,auVar137);
  local_80._4_4_ = auVar146._4_4_ * 0.99999964;
  local_80._0_4_ = auVar146._0_4_ * 0.99999964;
  local_80._8_4_ = auVar146._8_4_ * 0.99999964;
  local_80._12_4_ = auVar146._12_4_ * 0.99999964;
  local_80._16_4_ = auVar146._16_4_ * 0.99999964;
  local_80._20_4_ = auVar146._20_4_ * 0.99999964;
  local_80._24_4_ = auVar146._24_4_ * 0.99999964;
  local_80._28_4_ = auVar146._28_4_;
  auVar146 = vpmaxsd_avx2(auVar153,auVar22);
  auVar137 = vpmaxsd_avx2(auVar179,auVar23);
  auVar146 = vminps_avx(auVar146,auVar137);
  auVar137 = vpmaxsd_avx2(auVar203,auVar24);
  fVar163 = (ray->super_RayK<1>).tfar;
  auVar176._4_4_ = fVar163;
  auVar176._0_4_ = fVar163;
  auVar176._8_4_ = fVar163;
  auVar176._12_4_ = fVar163;
  auVar176._16_4_ = fVar163;
  auVar176._20_4_ = fVar163;
  auVar176._24_4_ = fVar163;
  auVar176._28_4_ = fVar163;
  auVar137 = vminps_avx(auVar137,auVar176);
  auVar146 = vminps_avx(auVar146,auVar137);
  auVar21._4_4_ = auVar146._4_4_ * 1.0000004;
  auVar21._0_4_ = auVar146._0_4_ * 1.0000004;
  auVar21._8_4_ = auVar146._8_4_ * 1.0000004;
  auVar21._12_4_ = auVar146._12_4_ * 1.0000004;
  auVar21._16_4_ = auVar146._16_4_ * 1.0000004;
  auVar21._20_4_ = auVar146._20_4_ * 1.0000004;
  auVar21._24_4_ = auVar146._24_4_ * 1.0000004;
  auVar21._28_4_ = auVar146._28_4_;
  auVar146._1_3_ = 0;
  auVar146[0] = PVar15;
  auVar146[4] = PVar15;
  auVar146._5_3_ = 0;
  auVar146[8] = PVar15;
  auVar146._9_3_ = 0;
  auVar146[0xc] = PVar15;
  auVar146._13_3_ = 0;
  auVar146[0x10] = PVar15;
  auVar146._17_3_ = 0;
  auVar146[0x14] = PVar15;
  auVar146._21_3_ = 0;
  auVar146[0x18] = PVar15;
  auVar146._25_3_ = 0;
  auVar146[0x1c] = PVar15;
  auVar146._29_3_ = 0;
  auVar137 = vpcmpgtd_avx2(auVar146,_DAT_0205a920);
  auVar146 = vcmpps_avx(local_80,auVar21,2);
  auVar146 = vandps_avx(auVar146,auVar137);
  uVar115 = vmovmskps_avx(auVar146);
  if (uVar115 != 0) {
    uVar115 = uVar115 & 0xff;
    local_520 = mm_lookupmask_ps._16_8_;
    uStack_518 = mm_lookupmask_ps._24_8_;
    uStack_510 = mm_lookupmask_ps._16_8_;
    uStack_508 = mm_lookupmask_ps._24_8_;
    local_1f0 = 0x7fffffff;
    uStack_1ec = 0x7fffffff;
    uStack_1e8 = 0x7fffffff;
    uStack_1e4 = 0x7fffffff;
    do {
      auVar146 = local_4c0;
      lVar25 = 0;
      for (uVar118 = (ulong)uVar115; (uVar118 & 1) == 0; uVar118 = uVar118 >> 1 | 0x8000000000000000
          ) {
        lVar25 = lVar25 + 1;
      }
      uVar117 = *(uint *)(local_528 + 2);
      uVar16 = *(uint *)(local_528 + lVar25 * 4 + 6);
      local_828 = (ulong)uVar117;
      pGVar123 = (context->scene->geometries).items[uVar117].ptr;
      local_7d8 = (ulong)uVar16;
      uVar118 = (ulong)*(uint *)(*(long *)&pGVar123->field_0x58 +
                                (ulong)uVar16 *
                                pGVar123[1].super_RefCount.refCounter.
                                super___atomic_base<unsigned_long>._M_i);
      fVar163 = (pGVar123->time_range).lower;
      fVar163 = pGVar123->fnumTimeSegments *
                (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar163) /
                ((pGVar123->time_range).upper - fVar163));
      auVar191 = vroundss_avx(ZEXT416((uint)fVar163),ZEXT416((uint)fVar163),9);
      auVar191 = vminss_avx(auVar191,ZEXT416((uint)(pGVar123->fnumTimeSegments + -1.0)));
      auVar191 = vmaxss_avx(ZEXT816(0) << 0x20,auVar191);
      fVar163 = fVar163 - auVar191._0_4_;
      _Var18 = pGVar123[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar121 = (long)(int)auVar191._0_4_ * 0x38;
      lVar25 = *(long *)(_Var18 + 0x10 + lVar121);
      lVar120 = *(long *)(_Var18 + 0x38 + lVar121);
      lVar19 = *(long *)(_Var18 + 0x48 + lVar121);
      pfVar1 = (float *)(lVar120 + uVar118 * lVar19);
      auVar188._0_4_ = fVar163 * *pfVar1;
      auVar188._4_4_ = fVar163 * pfVar1[1];
      auVar188._8_4_ = fVar163 * pfVar1[2];
      auVar188._12_4_ = fVar163 * pfVar1[3];
      pfVar1 = (float *)(lVar120 + (uVar118 + 1) * lVar19);
      auVar219._0_4_ = fVar163 * *pfVar1;
      auVar219._4_4_ = fVar163 * pfVar1[1];
      auVar219._8_4_ = fVar163 * pfVar1[2];
      auVar219._12_4_ = fVar163 * pfVar1[3];
      pfVar1 = (float *)(lVar120 + (uVar118 + 2) * lVar19);
      auVar165._0_4_ = fVar163 * *pfVar1;
      auVar165._4_4_ = fVar163 * pfVar1[1];
      auVar165._8_4_ = fVar163 * pfVar1[2];
      auVar165._12_4_ = fVar163 * pfVar1[3];
      pfVar1 = (float *)(lVar120 + lVar19 * (uVar118 + 3));
      auVar183._0_4_ = fVar163 * *pfVar1;
      auVar183._4_4_ = fVar163 * pfVar1[1];
      auVar183._8_4_ = fVar163 * pfVar1[2];
      auVar183._12_4_ = fVar163 * pfVar1[3];
      lVar120 = *(long *)(_Var18 + lVar121);
      fVar163 = 1.0 - fVar163;
      auVar128._4_4_ = fVar163;
      auVar128._0_4_ = fVar163;
      auVar128._8_4_ = fVar163;
      auVar128._12_4_ = fVar163;
      local_7d0 = vfmadd231ps_fma(auVar188,auVar128,
                                  *(undefined1 (*) [16])(lVar120 + lVar25 * uVar118));
      local_6a0 = vfmadd231ps_fma(auVar219,auVar128,
                                  *(undefined1 (*) [16])(lVar120 + lVar25 * (uVar118 + 1)));
      local_6b0 = vfmadd231ps_fma(auVar165,auVar128,
                                  *(undefined1 (*) [16])(lVar120 + lVar25 * (uVar118 + 2)));
      _local_6c0 = vfmadd231ps_fma(auVar183,auVar128,
                                   *(undefined1 (*) [16])(lVar120 + lVar25 * (uVar118 + 3)));
      iVar17 = (int)pGVar123[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar25 = (long)iVar17 * 0x44;
      aVar5 = (ray->super_RayK<1>).org.field_0;
      auVar127 = local_7d0;
      auVar8 = vsubps_avx(local_7d0,(undefined1  [16])aVar5);
      uVar125 = auVar8._0_4_;
      auVar166._4_4_ = uVar125;
      auVar166._0_4_ = uVar125;
      auVar166._8_4_ = uVar125;
      auVar166._12_4_ = uVar125;
      auVar191 = vshufps_avx(auVar8,auVar8,0x55);
      auVar8 = vshufps_avx(auVar8,auVar8,0xaa);
      aVar6 = (local_7b8->ray_space).vx.field_0;
      aVar7 = (local_7b8->ray_space).vy.field_0;
      fVar163 = (local_7b8->ray_space).vz.field_0.m128[0];
      fVar140 = (local_7b8->ray_space).vz.field_0.m128[1];
      fVar141 = (local_7b8->ray_space).vz.field_0.m128[2];
      fVar142 = (local_7b8->ray_space).vz.field_0.m128[3];
      auVar213._0_4_ = auVar8._0_4_ * fVar163;
      auVar213._4_4_ = auVar8._4_4_ * fVar140;
      auVar213._8_4_ = auVar8._8_4_ * fVar141;
      auVar213._12_4_ = auVar8._12_4_ * fVar142;
      auVar191 = vfmadd231ps_fma(auVar213,(undefined1  [16])aVar7,auVar191);
      auVar11 = vfmadd231ps_fma(auVar191,(undefined1  [16])aVar6,auVar166);
      auVar191 = vblendps_avx(auVar11,local_7d0,8);
      auVar165 = local_6a0;
      auVar9 = vsubps_avx(local_6a0,(undefined1  [16])aVar5);
      uVar125 = auVar9._0_4_;
      auVar184._4_4_ = uVar125;
      auVar184._0_4_ = uVar125;
      auVar184._8_4_ = uVar125;
      auVar184._12_4_ = uVar125;
      auVar8 = vshufps_avx(auVar9,auVar9,0x55);
      auVar9 = vshufps_avx(auVar9,auVar9,0xaa);
      auVar214._0_4_ = auVar9._0_4_ * fVar163;
      auVar214._4_4_ = auVar9._4_4_ * fVar140;
      auVar214._8_4_ = auVar9._8_4_ * fVar141;
      auVar214._12_4_ = auVar9._12_4_ * fVar142;
      auVar8 = vfmadd231ps_fma(auVar214,(undefined1  [16])aVar7,auVar8);
      auVar12 = vfmadd231ps_fma(auVar8,(undefined1  [16])aVar6,auVar184);
      auVar8 = vblendps_avx(auVar12,local_6a0,8);
      auVar128 = local_6b0;
      auVar10 = vsubps_avx(local_6b0,(undefined1  [16])aVar5);
      uVar125 = auVar10._0_4_;
      auVar205._4_4_ = uVar125;
      auVar205._0_4_ = uVar125;
      auVar205._8_4_ = uVar125;
      auVar205._12_4_ = uVar125;
      auVar9 = vshufps_avx(auVar10,auVar10,0x55);
      auVar10 = vshufps_avx(auVar10,auVar10,0xaa);
      auVar215._0_4_ = auVar10._0_4_ * fVar163;
      auVar215._4_4_ = auVar10._4_4_ * fVar140;
      auVar215._8_4_ = auVar10._8_4_ * fVar141;
      auVar215._12_4_ = auVar10._12_4_ * fVar142;
      auVar9 = vfmadd231ps_fma(auVar215,(undefined1  [16])aVar7,auVar9);
      auVar13 = vfmadd231ps_fma(auVar9,(undefined1  [16])aVar6,auVar205);
      auVar9 = vblendps_avx(auVar13,local_6b0,8);
      auVar164 = _local_6c0;
      auVar129 = vsubps_avx(_local_6c0,(undefined1  [16])aVar5);
      uVar125 = auVar129._0_4_;
      auVar206._4_4_ = uVar125;
      auVar206._0_4_ = uVar125;
      auVar206._8_4_ = uVar125;
      auVar206._12_4_ = uVar125;
      auVar10 = vshufps_avx(auVar129,auVar129,0x55);
      auVar129 = vshufps_avx(auVar129,auVar129,0xaa);
      auVar225._0_4_ = auVar129._0_4_ * fVar163;
      auVar225._4_4_ = auVar129._4_4_ * fVar140;
      auVar225._8_4_ = auVar129._8_4_ * fVar141;
      auVar225._12_4_ = auVar129._12_4_ * fVar142;
      auVar10 = vfmadd231ps_fma(auVar225,(undefined1  [16])aVar7,auVar10);
      auVar14 = vfmadd231ps_fma(auVar10,(undefined1  [16])aVar6,auVar206);
      auVar10 = vblendps_avx(auVar14,_local_6c0,8);
      auVar26._4_4_ = uStack_1ec;
      auVar26._0_4_ = local_1f0;
      auVar26._8_4_ = uStack_1e8;
      auVar26._12_4_ = uStack_1e4;
      auVar191 = vandps_avx(auVar191,auVar26);
      auVar8 = vandps_avx(auVar8,auVar26);
      auVar129 = vmaxps_avx(auVar191,auVar8);
      auVar191 = vandps_avx(auVar9,auVar26);
      auVar8 = vandps_avx(auVar10,auVar26);
      auVar191 = vmaxps_avx(auVar191,auVar8);
      auVar191 = vmaxps_avx(auVar129,auVar191);
      auVar8 = vmovshdup_avx(auVar191);
      auVar8 = vmaxss_avx(auVar8,auVar191);
      auVar191 = vshufpd_avx(auVar191,auVar191,1);
      auVar191 = vmaxss_avx(auVar191,auVar8);
      auVar8 = vmovshdup_avx(auVar11);
      uVar126 = auVar8._0_8_;
      local_460._8_8_ = uVar126;
      local_460._0_8_ = uVar126;
      local_460._16_8_ = uVar126;
      local_460._24_8_ = uVar126;
      auVar8 = vmovshdup_avx(auVar12);
      uVar126 = auVar8._0_8_;
      local_440._8_8_ = uVar126;
      local_440._0_8_ = uVar126;
      local_440._16_8_ = uVar126;
      local_440._24_8_ = uVar126;
      auVar137 = *(undefined1 (*) [32])(bspline_basis0 + lVar25 + 0x908);
      uVar212 = auVar13._0_4_;
      local_600._4_4_ = uVar212;
      local_600._0_4_ = uVar212;
      local_600._8_4_ = uVar212;
      local_600._12_4_ = uVar212;
      local_600._16_4_ = uVar212;
      local_600._20_4_ = uVar212;
      local_600._24_4_ = uVar212;
      local_600._28_4_ = uVar212;
      auVar8 = vmovshdup_avx(auVar13);
      uVar126 = auVar8._0_8_;
      local_720._8_8_ = uVar126;
      local_720._0_8_ = uVar126;
      local_720._16_8_ = uVar126;
      local_720._24_8_ = uVar126;
      fVar163 = *(float *)*(undefined1 (*) [28])(bspline_basis0 + lVar25 + 0xd8c);
      auVar114 = *(undefined1 (*) [28])(bspline_basis0 + lVar25 + 0xd8c);
      auVar8 = vmovshdup_avx(auVar14);
      local_740 = auVar8._0_8_;
      fVar223 = auVar14._0_4_;
      auVar147._0_4_ = fVar223 * fVar163;
      auVar147._4_4_ = fVar223 * *(float *)(bspline_basis0 + lVar25 + 0xd90);
      auVar147._8_4_ = fVar223 * *(float *)(bspline_basis0 + lVar25 + 0xd94);
      auVar147._12_4_ = fVar223 * *(float *)(bspline_basis0 + lVar25 + 0xd98);
      auVar147._16_4_ = fVar223 * *(float *)(bspline_basis0 + lVar25 + 0xd9c);
      auVar147._20_4_ = fVar223 * *(float *)(bspline_basis0 + lVar25 + 0xda0);
      auVar147._24_4_ = fVar223 * *(float *)(bspline_basis0 + lVar25 + 0xda4);
      auVar147._28_4_ = 0;
      auVar9 = vfmadd231ps_fma(auVar147,auVar137,local_600);
      fVar162 = auVar8._0_4_;
      fVar182 = auVar8._4_4_;
      auVar27._4_4_ = fVar182 * *(float *)(bspline_basis0 + lVar25 + 0xd90);
      auVar27._0_4_ = fVar162 * fVar163;
      auVar27._8_4_ = fVar162 * *(float *)(bspline_basis0 + lVar25 + 0xd94);
      auVar27._12_4_ = fVar182 * *(float *)(bspline_basis0 + lVar25 + 0xd98);
      auVar27._16_4_ = fVar162 * *(float *)(bspline_basis0 + lVar25 + 0xd9c);
      auVar27._20_4_ = fVar182 * *(float *)(bspline_basis0 + lVar25 + 0xda0);
      auVar27._24_4_ = fVar162 * *(float *)(bspline_basis0 + lVar25 + 0xda4);
      auVar27._28_4_ = *(undefined4 *)(bspline_basis0 + lVar25 + 0xda8);
      auVar8 = vfmadd231ps_fma(auVar27,auVar137,local_720);
      auVar135 = *(undefined1 (*) [32])(bspline_basis0 + lVar25 + 0x484);
      uVar125 = auVar12._0_4_;
      local_760._4_4_ = uVar125;
      local_760._0_4_ = uVar125;
      local_760._8_4_ = uVar125;
      local_760._12_4_ = uVar125;
      local_760._16_4_ = uVar125;
      local_760._20_4_ = uVar125;
      local_760._24_4_ = uVar125;
      local_760._28_4_ = uVar125;
      auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar135,local_760);
      auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar135,local_440);
      auVar153 = *(undefined1 (*) [32])(bspline_basis0 + lVar25);
      uVar125 = auVar11._0_4_;
      local_700._4_4_ = uVar125;
      local_700._0_4_ = uVar125;
      local_700._8_4_ = uVar125;
      local_700._12_4_ = uVar125;
      local_700._16_4_ = uVar125;
      local_700._20_4_ = uVar125;
      local_700._24_4_ = uVar125;
      local_700._28_4_ = uVar125;
      auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar153,local_700);
      auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar153,local_460);
      auVar22 = *(undefined1 (*) [32])(bspline_basis1 + lVar25 + 0x908);
      fVar140 = *(float *)(bspline_basis1 + lVar25 + 0xd8c);
      fVar141 = *(float *)(bspline_basis1 + lVar25 + 0xd90);
      fVar142 = *(float *)(bspline_basis1 + lVar25 + 0xd94);
      fVar143 = *(float *)(bspline_basis1 + lVar25 + 0xd98);
      fVar144 = *(float *)(bspline_basis1 + lVar25 + 0xd9c);
      fVar145 = *(float *)(bspline_basis1 + lVar25 + 0xda0);
      fVar100 = *(float *)(bspline_basis1 + lVar25 + 0xda4);
      local_6e0 = fVar223;
      fStack_6dc = fVar223;
      fStack_6d8 = fVar223;
      fStack_6d4 = fVar223;
      fStack_6d0 = fVar223;
      fStack_6cc = fVar223;
      fStack_6c8 = fVar223;
      fStack_6c4 = fVar223;
      auVar28._4_4_ = fVar223 * fVar141;
      auVar28._0_4_ = fVar223 * fVar140;
      auVar28._8_4_ = fVar223 * fVar142;
      auVar28._12_4_ = fVar223 * fVar143;
      auVar28._16_4_ = fVar223 * fVar144;
      auVar28._20_4_ = fVar223 * fVar145;
      auVar28._24_4_ = fVar223 * fVar100;
      auVar28._28_4_ = fVar223;
      auVar10 = vfmadd231ps_fma(auVar28,auVar22,local_600);
      uStack_738 = local_740;
      uStack_730 = local_740;
      uStack_728 = local_740;
      auVar29._4_4_ = fVar182 * fVar141;
      auVar29._0_4_ = fVar162 * fVar140;
      auVar29._8_4_ = fVar162 * fVar142;
      auVar29._12_4_ = fVar182 * fVar143;
      auVar29._16_4_ = fVar162 * fVar144;
      auVar29._20_4_ = fVar182 * fVar145;
      auVar29._24_4_ = fVar162 * fVar100;
      auVar29._28_4_ = fVar182;
      auVar129 = vfmadd231ps_fma(auVar29,auVar22,local_720);
      auVar179 = *(undefined1 (*) [32])(bspline_basis1 + lVar25 + 0x484);
      auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar179,local_760);
      auVar129 = vfmadd231ps_fma(ZEXT1632(auVar129),auVar179,local_440);
      auVar23 = *(undefined1 (*) [32])(bspline_basis1 + lVar25);
      auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar23,local_700);
      auVar129 = vfmadd231ps_fma(ZEXT1632(auVar129),auVar23,local_460);
      _local_4a0 = ZEXT1632(auVar10);
      auVar148 = ZEXT1632(auVar9);
      auVar24 = vsubps_avx(_local_4a0,auVar148);
      local_220 = ZEXT1632(auVar129);
      _local_240 = ZEXT1632(auVar8);
      local_260 = vsubps_avx(local_220,_local_240);
      auVar130._0_4_ = auVar24._0_4_ * auVar8._0_4_;
      auVar130._4_4_ = auVar24._4_4_ * auVar8._4_4_;
      auVar130._8_4_ = auVar24._8_4_ * auVar8._8_4_;
      auVar130._12_4_ = auVar24._12_4_ * auVar8._12_4_;
      auVar130._16_4_ = auVar24._16_4_ * 0.0;
      auVar130._20_4_ = auVar24._20_4_ * 0.0;
      auVar130._24_4_ = auVar24._24_4_ * 0.0;
      auVar130._28_4_ = 0;
      fVar237 = local_260._0_4_;
      auVar149._0_4_ = fVar237 * auVar9._0_4_;
      fVar239 = local_260._4_4_;
      auVar149._4_4_ = fVar239 * auVar9._4_4_;
      fVar240 = local_260._8_4_;
      auVar149._8_4_ = fVar240 * auVar9._8_4_;
      fVar241 = local_260._12_4_;
      auVar149._12_4_ = fVar241 * auVar9._12_4_;
      fVar242 = local_260._16_4_;
      auVar149._16_4_ = fVar242 * 0.0;
      fVar244 = local_260._20_4_;
      auVar149._20_4_ = fVar244 * 0.0;
      fVar246 = local_260._24_4_;
      auVar149._24_4_ = fVar246 * 0.0;
      auVar149._28_4_ = 0;
      auVar156 = vsubps_avx(auVar130,auVar149);
      auVar8 = vpermilps_avx(local_7d0,0xff);
      uVar126 = auVar8._0_8_;
      local_a0._8_8_ = uVar126;
      local_a0._0_8_ = uVar126;
      local_a0._16_8_ = uVar126;
      local_a0._24_8_ = uVar126;
      auVar9 = vpermilps_avx(local_6a0,0xff);
      uVar126 = auVar9._0_8_;
      local_c0._8_8_ = uVar126;
      local_c0._0_8_ = uVar126;
      local_c0._16_8_ = uVar126;
      local_c0._24_8_ = uVar126;
      auVar9 = vpermilps_avx(local_6b0,0xff);
      uVar126 = auVar9._0_8_;
      local_e0._8_8_ = uVar126;
      local_e0._0_8_ = uVar126;
      local_e0._16_8_ = uVar126;
      local_e0._24_8_ = uVar126;
      auVar9 = vpermilps_avx(_local_6c0,0xff);
      local_100 = auVar9._0_8_;
      local_820._0_4_ = auVar114._0_4_;
      local_820._4_4_ = auVar114._4_4_;
      fStack_818 = auVar114._8_4_;
      fStack_814 = auVar114._12_4_;
      fStack_810 = auVar114._16_4_;
      fStack_80c = auVar114._20_4_;
      fStack_808 = auVar114._24_4_;
      fVar163 = auVar9._0_4_;
      fVar161 = auVar9._4_4_;
      auVar30._4_4_ = fVar161 * (float)local_820._4_4_;
      auVar30._0_4_ = fVar163 * (float)local_820._0_4_;
      auVar30._8_4_ = fVar163 * fStack_818;
      auVar30._12_4_ = fVar161 * fStack_814;
      auVar30._16_4_ = fVar163 * fStack_810;
      auVar30._20_4_ = fVar161 * fStack_80c;
      auVar30._24_4_ = fVar163 * fStack_808;
      auVar30._28_4_ = uVar212;
      auVar9 = vfmadd231ps_fma(auVar30,local_e0,auVar137);
      auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar135,local_c0);
      auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar153,local_a0);
      uStack_f8 = local_100;
      uStack_f0 = local_100;
      uStack_e8 = local_100;
      auVar31._4_4_ = fVar161 * fVar141;
      auVar31._0_4_ = fVar163 * fVar140;
      auVar31._8_4_ = fVar163 * fVar142;
      auVar31._12_4_ = fVar161 * fVar143;
      auVar31._16_4_ = fVar163 * fVar144;
      auVar31._20_4_ = fVar161 * fVar145;
      auVar31._24_4_ = fVar163 * fVar100;
      auVar31._28_4_ = auVar153._28_4_;
      auVar10 = vfmadd231ps_fma(auVar31,auVar22,local_e0);
      auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar179,local_c0);
      auVar235 = ZEXT3264(auVar23);
      auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar23,local_a0);
      auVar32._4_4_ = fVar239 * fVar239;
      auVar32._0_4_ = fVar237 * fVar237;
      auVar32._8_4_ = fVar240 * fVar240;
      auVar32._12_4_ = fVar241 * fVar241;
      auVar32._16_4_ = fVar242 * fVar242;
      auVar32._20_4_ = fVar244 * fVar244;
      auVar32._24_4_ = fVar246 * fVar246;
      auVar32._28_4_ = auVar8._4_4_;
      auVar8 = vfmadd231ps_fma(auVar32,auVar24,auVar24);
      auVar203 = vmaxps_avx(ZEXT1632(auVar9),ZEXT1632(auVar10));
      auVar33._4_4_ = auVar203._4_4_ * auVar203._4_4_ * auVar8._4_4_;
      auVar33._0_4_ = auVar203._0_4_ * auVar203._0_4_ * auVar8._0_4_;
      auVar33._8_4_ = auVar203._8_4_ * auVar203._8_4_ * auVar8._8_4_;
      auVar33._12_4_ = auVar203._12_4_ * auVar203._12_4_ * auVar8._12_4_;
      auVar33._16_4_ = auVar203._16_4_ * auVar203._16_4_ * 0.0;
      auVar33._20_4_ = auVar203._20_4_ * auVar203._20_4_ * 0.0;
      auVar33._24_4_ = auVar203._24_4_ * auVar203._24_4_ * 0.0;
      auVar33._28_4_ = auVar203._28_4_;
      auVar34._4_4_ = auVar156._4_4_ * auVar156._4_4_;
      auVar34._0_4_ = auVar156._0_4_ * auVar156._0_4_;
      auVar34._8_4_ = auVar156._8_4_ * auVar156._8_4_;
      auVar34._12_4_ = auVar156._12_4_ * auVar156._12_4_;
      auVar34._16_4_ = auVar156._16_4_ * auVar156._16_4_;
      auVar34._20_4_ = auVar156._20_4_ * auVar156._20_4_;
      auVar34._24_4_ = auVar156._24_4_ * auVar156._24_4_;
      auVar34._28_4_ = auVar156._28_4_;
      auVar203 = vcmpps_avx(auVar34,auVar33,2);
      fVar163 = auVar191._0_4_ * 4.7683716e-07;
      auVar129 = ZEXT416((uint)fVar163);
      local_800._0_16_ = auVar129;
      auVar131._0_4_ = (float)iVar17;
      local_4c0._4_12_ = auVar14._4_12_;
      local_4c0._0_4_ = auVar131._0_4_;
      local_4c0._16_16_ = auVar146._16_16_;
      auVar131._4_4_ = auVar131._0_4_;
      auVar131._8_4_ = auVar131._0_4_;
      auVar131._12_4_ = auVar131._0_4_;
      auVar131._16_4_ = auVar131._0_4_;
      auVar131._20_4_ = auVar131._0_4_;
      auVar131._24_4_ = auVar131._0_4_;
      auVar131._28_4_ = auVar131._0_4_;
      auVar146 = vcmpps_avx(_DAT_02020f40,auVar131,1);
      auVar8 = vpermilps_avx(auVar11,0xaa);
      uVar126 = auVar8._0_8_;
      local_500._8_8_ = uVar126;
      local_500._0_8_ = uVar126;
      local_500._16_8_ = uVar126;
      local_500._24_8_ = uVar126;
      auVar191 = vpermilps_avx(auVar12,0xaa);
      uVar126 = auVar191._0_8_;
      local_5c0._8_8_ = uVar126;
      local_5c0._0_8_ = uVar126;
      local_5c0._16_8_ = uVar126;
      local_5c0._24_8_ = uVar126;
      auVar191 = vpermilps_avx(auVar13,0xaa);
      uVar126 = auVar191._0_8_;
      local_420._8_8_ = uVar126;
      local_420._0_8_ = uVar126;
      local_420._16_8_ = uVar126;
      local_420._24_8_ = uVar126;
      auVar191 = vshufps_avx(auVar14,auVar14,0xaa);
      uVar126 = auVar191._0_8_;
      auVar156 = auVar146 & auVar203;
      uVar119 = *(uint *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
      local_640._0_16_ = ZEXT416(uVar119);
      fVar161 = fVar223;
      fVar237 = fVar223;
      fVar239 = fVar223;
      fVar240 = fVar223;
      fVar241 = fVar223;
      fVar242 = fVar223;
      fVar244 = fVar162;
      fVar246 = fVar182;
      fVar243 = fVar162;
      fVar245 = fVar182;
      fVar247 = fVar162;
      fVar248 = fVar182;
      uVar229 = uVar126;
      uVar230 = uVar126;
      uVar231 = uVar126;
      if ((((((((auVar156 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar156 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar156 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar156 >> 0x7f,0) == '\0') &&
            (auVar156 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar156 >> 0xbf,0) == '\0') &&
          (auVar156 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar156[0x1f]) {
LAB_0195f085:
        auVar251 = ZEXT3264(local_760);
        auVar222 = ZEXT3264(local_720);
        auVar211 = ZEXT3264(local_700);
      }
      else {
        local_280 = vandps_avx(auVar203,auVar146);
        fVar224 = auVar191._0_4_;
        fVar228 = auVar191._4_4_;
        auVar35._4_4_ = fVar228 * fVar141;
        auVar35._0_4_ = fVar224 * fVar140;
        auVar35._8_4_ = fVar224 * fVar142;
        auVar35._12_4_ = fVar228 * fVar143;
        auVar35._16_4_ = fVar224 * fVar144;
        auVar35._20_4_ = fVar228 * fVar145;
        auVar35._24_4_ = fVar224 * fVar100;
        auVar35._28_4_ = local_280._28_4_;
        auVar191 = vfmadd213ps_fma(auVar22,local_420,auVar35);
        auVar191 = vfmadd213ps_fma(auVar179,local_5c0,ZEXT1632(auVar191));
        auVar191 = vfmadd213ps_fma(auVar23,local_500,ZEXT1632(auVar191));
        local_480 = ZEXT1632(auVar191);
        auVar36._4_4_ = fVar228 * (float)local_820._4_4_;
        auVar36._0_4_ = fVar224 * (float)local_820._0_4_;
        auVar36._8_4_ = fVar224 * fStack_818;
        auVar36._12_4_ = fVar228 * fStack_814;
        auVar36._16_4_ = fVar224 * fStack_810;
        auVar36._20_4_ = fVar228 * fStack_80c;
        auVar36._24_4_ = fVar224 * fStack_808;
        auVar36._28_4_ = local_280._28_4_;
        auVar191 = vfmadd213ps_fma(auVar137,local_420,auVar36);
        auVar191 = vfmadd213ps_fma(auVar135,local_5c0,ZEXT1632(auVar191));
        auVar146 = *(undefined1 (*) [32])(bspline_basis0 + lVar25 + 0x1210);
        auVar137 = *(undefined1 (*) [32])(bspline_basis0 + lVar25 + 0x1694);
        auVar135 = *(undefined1 (*) [32])(bspline_basis0 + lVar25 + 0x1b18);
        fVar140 = *(float *)(bspline_basis0 + lVar25 + 0x1f9c);
        fVar141 = *(float *)(bspline_basis0 + lVar25 + 0x1fa0);
        fVar142 = *(float *)(bspline_basis0 + lVar25 + 0x1fa4);
        fVar143 = *(float *)(bspline_basis0 + lVar25 + 0x1fa8);
        fVar144 = *(float *)(bspline_basis0 + lVar25 + 0x1fac);
        fVar145 = *(float *)(bspline_basis0 + lVar25 + 0x1fb0);
        fVar100 = *(float *)(bspline_basis0 + lVar25 + 0x1fb4);
        auVar37._4_4_ = fVar141 * fVar223;
        auVar37._0_4_ = fVar140 * fVar223;
        auVar37._8_4_ = fVar142 * fVar223;
        auVar37._12_4_ = fVar143 * fVar223;
        auVar37._16_4_ = fVar144 * fVar223;
        auVar37._20_4_ = fVar145 * fVar223;
        auVar37._24_4_ = fVar100 * fVar223;
        auVar37._28_4_ = auVar8._4_4_;
        auVar38._4_4_ = fVar182 * fVar141;
        auVar38._0_4_ = fVar162 * fVar140;
        auVar38._8_4_ = fVar162 * fVar142;
        auVar38._12_4_ = fVar182 * fVar143;
        auVar38._16_4_ = fVar162 * fVar144;
        auVar38._20_4_ = fVar182 * fVar145;
        auVar38._24_4_ = fVar162 * fVar100;
        auVar38._28_4_ = auVar24._28_4_;
        auVar220._0_4_ = fVar224 * fVar140;
        auVar220._4_4_ = fVar228 * fVar141;
        auVar220._8_4_ = fVar224 * fVar142;
        auVar220._12_4_ = fVar228 * fVar143;
        auVar220._16_4_ = fVar224 * fVar144;
        auVar220._20_4_ = fVar228 * fVar145;
        auVar220._24_4_ = fVar224 * fVar100;
        auVar220._28_4_ = 0;
        auVar8 = vfmadd231ps_fma(auVar37,auVar135,local_600);
        auVar11 = vfmadd231ps_fma(auVar38,auVar135,local_720);
        auVar12 = vfmadd231ps_fma(auVar220,local_420,auVar135);
        auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar137,local_760);
        auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar137,local_440);
        auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),local_5c0,auVar137);
        auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar146,local_700);
        auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar146,local_460);
        auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar146,local_500);
        fVar140 = *(float *)(bspline_basis1 + lVar25 + 0x1f9c);
        fVar141 = *(float *)(bspline_basis1 + lVar25 + 0x1fa0);
        fVar142 = *(float *)(bspline_basis1 + lVar25 + 0x1fa4);
        fVar143 = *(float *)(bspline_basis1 + lVar25 + 0x1fa8);
        fVar144 = *(float *)(bspline_basis1 + lVar25 + 0x1fac);
        fVar145 = *(float *)(bspline_basis1 + lVar25 + 0x1fb0);
        fVar100 = *(float *)(bspline_basis1 + lVar25 + 0x1fb4);
        auVar137._4_4_ = fVar223 * fVar141;
        auVar137._0_4_ = fVar223 * fVar140;
        auVar137._8_4_ = fVar223 * fVar142;
        auVar137._12_4_ = fVar223 * fVar143;
        auVar137._16_4_ = fVar223 * fVar144;
        auVar137._20_4_ = fVar223 * fVar145;
        auVar137._24_4_ = fVar223 * fVar100;
        auVar137._28_4_ = fVar223;
        auVar39._4_4_ = fVar182 * fVar141;
        auVar39._0_4_ = fVar162 * fVar140;
        auVar39._8_4_ = fVar162 * fVar142;
        auVar39._12_4_ = fVar182 * fVar143;
        auVar39._16_4_ = fVar162 * fVar144;
        auVar39._20_4_ = fVar182 * fVar145;
        auVar39._24_4_ = fVar162 * fVar100;
        auVar39._28_4_ = fVar182;
        uStack_618 = uVar126;
        local_620 = uVar126;
        uStack_610 = uVar126;
        uStack_608 = uVar126;
        auVar40._4_4_ = fVar228 * fVar141;
        auVar40._0_4_ = fVar224 * fVar140;
        auVar40._8_4_ = fVar224 * fVar142;
        auVar40._12_4_ = fVar228 * fVar143;
        auVar40._16_4_ = fVar224 * fVar144;
        auVar40._20_4_ = fVar228 * fVar145;
        auVar40._24_4_ = fVar224 * fVar100;
        auVar40._28_4_ = fVar228;
        auVar146 = *(undefined1 (*) [32])(bspline_basis1 + lVar25 + 0x1b18);
        auVar13 = vfmadd231ps_fma(auVar137,auVar146,local_600);
        auVar14 = vfmadd231ps_fma(auVar39,auVar146,local_720);
        auVar26 = vfmadd231ps_fma(auVar40,auVar146,local_420);
        auVar146 = *(undefined1 (*) [32])(bspline_basis1 + lVar25 + 0x1694);
        auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar146,local_760);
        auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar146,local_440);
        auVar26 = vfmadd231ps_fma(ZEXT1632(auVar26),local_5c0,auVar146);
        auVar146 = *(undefined1 (*) [32])(bspline_basis1 + lVar25 + 0x1210);
        auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar146,local_700);
        auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar146,local_460);
        auVar26 = vfmadd231ps_fma(ZEXT1632(auVar26),local_500,auVar146);
        auVar146 = vandps_avx(local_1e0,ZEXT1632(auVar8));
        auVar137 = vandps_avx(ZEXT1632(auVar11),local_1e0);
        auVar137 = vmaxps_avx(auVar146,auVar137);
        auVar146 = vandps_avx(ZEXT1632(auVar12),local_1e0);
        auVar146 = vmaxps_avx(auVar137,auVar146);
        auVar150._4_4_ = fVar163;
        auVar150._0_4_ = fVar163;
        auVar150._8_4_ = fVar163;
        auVar150._12_4_ = fVar163;
        auVar150._16_4_ = fVar163;
        auVar150._20_4_ = fVar163;
        auVar150._24_4_ = fVar163;
        auVar150._28_4_ = fVar163;
        auVar146 = vcmpps_avx(auVar146,auVar150,1);
        auVar135 = vblendvps_avx(ZEXT1632(auVar8),auVar24,auVar146);
        auVar22 = vblendvps_avx(ZEXT1632(auVar11),local_260,auVar146);
        auVar146 = vandps_avx(local_1e0,ZEXT1632(auVar13));
        auVar137 = vandps_avx(ZEXT1632(auVar14),local_1e0);
        auVar137 = vmaxps_avx(auVar146,auVar137);
        auVar146 = vandps_avx(ZEXT1632(auVar26),local_1e0);
        auVar146 = vmaxps_avx(auVar137,auVar146);
        auVar137 = vcmpps_avx(auVar146,auVar150,1);
        auVar146 = vblendvps_avx(ZEXT1632(auVar13),auVar24,auVar137);
        auVar137 = vblendvps_avx(ZEXT1632(auVar14),local_260,auVar137);
        auVar191 = vfmadd213ps_fma(auVar153,local_500,ZEXT1632(auVar191));
        auVar8 = vfmadd213ps_fma(auVar135,auVar135,ZEXT832(0) << 0x20);
        auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar22,auVar22);
        auVar153 = vrsqrtps_avx(ZEXT1632(auVar8));
        fVar163 = auVar153._0_4_;
        fVar140 = auVar153._4_4_;
        fVar141 = auVar153._8_4_;
        fVar142 = auVar153._12_4_;
        fVar143 = auVar153._16_4_;
        fVar144 = auVar153._20_4_;
        fVar145 = auVar153._24_4_;
        auVar41._4_4_ = fVar140 * fVar140 * fVar140 * auVar8._4_4_ * -0.5;
        auVar41._0_4_ = fVar163 * fVar163 * fVar163 * auVar8._0_4_ * -0.5;
        auVar41._8_4_ = fVar141 * fVar141 * fVar141 * auVar8._8_4_ * -0.5;
        auVar41._12_4_ = fVar142 * fVar142 * fVar142 * auVar8._12_4_ * -0.5;
        auVar41._16_4_ = fVar143 * fVar143 * fVar143 * -0.0;
        auVar41._20_4_ = fVar144 * fVar144 * fVar144 * -0.0;
        auVar41._24_4_ = fVar145 * fVar145 * fVar145 * -0.0;
        auVar41._28_4_ = 0;
        auVar234._8_4_ = 0x3fc00000;
        auVar234._0_8_ = 0x3fc000003fc00000;
        auVar234._12_4_ = 0x3fc00000;
        auVar234._16_4_ = 0x3fc00000;
        auVar234._20_4_ = 0x3fc00000;
        auVar234._24_4_ = 0x3fc00000;
        auVar234._28_4_ = 0x3fc00000;
        auVar8 = vfmadd231ps_fma(auVar41,auVar234,auVar153);
        fVar163 = auVar8._0_4_;
        fVar140 = auVar8._4_4_;
        auVar42._4_4_ = auVar22._4_4_ * fVar140;
        auVar42._0_4_ = auVar22._0_4_ * fVar163;
        fVar141 = auVar8._8_4_;
        auVar42._8_4_ = auVar22._8_4_ * fVar141;
        fVar142 = auVar8._12_4_;
        auVar42._12_4_ = auVar22._12_4_ * fVar142;
        auVar42._16_4_ = auVar22._16_4_ * 0.0;
        auVar42._20_4_ = auVar22._20_4_ * 0.0;
        auVar42._24_4_ = auVar22._24_4_ * 0.0;
        auVar42._28_4_ = auVar153._28_4_;
        auVar43._4_4_ = -auVar135._4_4_ * fVar140;
        auVar43._0_4_ = -auVar135._0_4_ * fVar163;
        auVar43._8_4_ = -auVar135._8_4_ * fVar141;
        auVar43._12_4_ = -auVar135._12_4_ * fVar142;
        auVar43._16_4_ = -auVar135._16_4_ * 0.0;
        auVar43._20_4_ = -auVar135._20_4_ * 0.0;
        auVar43._24_4_ = -auVar135._24_4_ * 0.0;
        auVar43._28_4_ = auVar24._28_4_;
        auVar8 = vfmadd213ps_fma(auVar146,auVar146,ZEXT832(0) << 0x20);
        auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar137,auVar137);
        auVar135 = vrsqrtps_avx(ZEXT1632(auVar8));
        auVar153 = ZEXT1632(CONCAT412(fVar142 * 0.0,
                                      CONCAT48(fVar141 * 0.0,CONCAT44(fVar140 * 0.0,fVar163 * 0.0)))
                           );
        fVar163 = auVar135._0_4_;
        fVar140 = auVar135._4_4_;
        fVar141 = auVar135._8_4_;
        fVar142 = auVar135._12_4_;
        fVar143 = auVar135._16_4_;
        fVar144 = auVar135._20_4_;
        fVar145 = auVar135._24_4_;
        auVar44._4_4_ = fVar140 * fVar140 * fVar140 * auVar8._4_4_ * -0.5;
        auVar44._0_4_ = fVar163 * fVar163 * fVar163 * auVar8._0_4_ * -0.5;
        auVar44._8_4_ = fVar141 * fVar141 * fVar141 * auVar8._8_4_ * -0.5;
        auVar44._12_4_ = fVar142 * fVar142 * fVar142 * auVar8._12_4_ * -0.5;
        auVar44._16_4_ = fVar143 * fVar143 * fVar143 * -0.0;
        auVar44._20_4_ = fVar144 * fVar144 * fVar144 * -0.0;
        auVar44._24_4_ = fVar145 * fVar145 * fVar145 * -0.0;
        auVar44._28_4_ = 0xbf000000;
        auVar8 = vfmadd231ps_fma(auVar44,auVar234,auVar135);
        fVar163 = auVar8._0_4_;
        fVar140 = auVar8._4_4_;
        auVar45._4_4_ = fVar140 * auVar137._4_4_;
        auVar45._0_4_ = fVar163 * auVar137._0_4_;
        fVar141 = auVar8._8_4_;
        auVar45._8_4_ = fVar141 * auVar137._8_4_;
        fVar142 = auVar8._12_4_;
        auVar45._12_4_ = fVar142 * auVar137._12_4_;
        auVar45._16_4_ = auVar137._16_4_ * 0.0;
        auVar45._20_4_ = auVar137._20_4_ * 0.0;
        auVar45._24_4_ = auVar137._24_4_ * 0.0;
        auVar45._28_4_ = 0;
        auVar46._4_4_ = fVar140 * -auVar146._4_4_;
        auVar46._0_4_ = fVar163 * -auVar146._0_4_;
        auVar46._8_4_ = fVar141 * -auVar146._8_4_;
        auVar46._12_4_ = fVar142 * -auVar146._12_4_;
        auVar46._16_4_ = -auVar146._16_4_ * 0.0;
        auVar46._20_4_ = -auVar146._20_4_ * 0.0;
        auVar46._24_4_ = -auVar146._24_4_ * 0.0;
        auVar46._28_4_ = 0x3fc00000;
        auVar47._28_4_ = auVar135._28_4_;
        auVar47._0_28_ =
             ZEXT1628(CONCAT412(fVar142 * 0.0,
                                CONCAT48(fVar141 * 0.0,CONCAT44(fVar140 * 0.0,fVar163 * 0.0))));
        auVar8 = vfmadd213ps_fma(auVar42,ZEXT1632(auVar9),auVar148);
        auVar146 = ZEXT1632(auVar9);
        auVar11 = vfmadd213ps_fma(auVar43,auVar146,_local_240);
        auVar12 = vfmadd213ps_fma(auVar153,auVar146,ZEXT1632(auVar191));
        auVar26 = vfnmadd213ps_fma(auVar42,auVar146,auVar148);
        auVar13 = vfmadd213ps_fma(auVar45,ZEXT1632(auVar10),_local_4a0);
        auVar166 = vfnmadd213ps_fma(auVar43,auVar146,_local_240);
        auVar146 = ZEXT1632(auVar10);
        auVar14 = vfmadd213ps_fma(auVar46,auVar146,local_220);
        _local_5e0 = ZEXT1632(auVar9);
        auVar191 = vfnmadd231ps_fma(ZEXT1632(auVar191),_local_5e0,auVar153);
        auVar9 = vfmadd213ps_fma(auVar47,auVar146,local_480);
        auVar183 = vfnmadd213ps_fma(auVar45,auVar146,_local_4a0);
        auVar184 = vfnmadd213ps_fma(auVar46,auVar146,local_220);
        local_660 = ZEXT1632(auVar10);
        auVar188 = vfnmadd231ps_fma(local_480,local_660,auVar47);
        auVar146 = vsubps_avx(ZEXT1632(auVar14),ZEXT1632(auVar166));
        auVar137 = vsubps_avx(ZEXT1632(auVar9),ZEXT1632(auVar191));
        auVar177._0_4_ = auVar146._0_4_ * auVar191._0_4_;
        auVar177._4_4_ = auVar146._4_4_ * auVar191._4_4_;
        auVar177._8_4_ = auVar146._8_4_ * auVar191._8_4_;
        auVar177._12_4_ = auVar146._12_4_ * auVar191._12_4_;
        auVar177._16_4_ = auVar146._16_4_ * 0.0;
        auVar177._20_4_ = auVar146._20_4_ * 0.0;
        auVar177._24_4_ = auVar146._24_4_ * 0.0;
        auVar177._28_4_ = 0;
        auVar10 = vfmsub231ps_fma(auVar177,ZEXT1632(auVar166),auVar137);
        auVar48._4_4_ = auVar26._4_4_ * auVar137._4_4_;
        auVar48._0_4_ = auVar26._0_4_ * auVar137._0_4_;
        auVar48._8_4_ = auVar26._8_4_ * auVar137._8_4_;
        auVar48._12_4_ = auVar26._12_4_ * auVar137._12_4_;
        auVar48._16_4_ = auVar137._16_4_ * 0.0;
        auVar48._20_4_ = auVar137._20_4_ * 0.0;
        auVar48._24_4_ = auVar137._24_4_ * 0.0;
        auVar48._28_4_ = auVar137._28_4_;
        auVar179 = ZEXT1632(auVar26);
        auVar137 = vsubps_avx(ZEXT1632(auVar13),auVar179);
        auVar203 = ZEXT1632(auVar191);
        auVar191 = vfmsub231ps_fma(auVar48,auVar203,auVar137);
        auVar49._4_4_ = auVar166._4_4_ * auVar137._4_4_;
        auVar49._0_4_ = auVar166._0_4_ * auVar137._0_4_;
        auVar49._8_4_ = auVar166._8_4_ * auVar137._8_4_;
        auVar49._12_4_ = auVar166._12_4_ * auVar137._12_4_;
        auVar49._16_4_ = auVar137._16_4_ * 0.0;
        auVar49._20_4_ = auVar137._20_4_ * 0.0;
        auVar49._24_4_ = auVar137._24_4_ * 0.0;
        auVar49._28_4_ = auVar137._28_4_;
        auVar26 = vfmsub231ps_fma(auVar49,auVar179,auVar146);
        auVar191 = vfmadd231ps_fma(ZEXT1632(auVar26),ZEXT832(0) << 0x20,ZEXT1632(auVar191));
        local_780 = ZEXT1632(local_280._16_16_);
        auVar191 = vfmadd231ps_fma(ZEXT1632(auVar191),ZEXT832(0) << 0x20,ZEXT1632(auVar10));
        auVar24 = vcmpps_avx(ZEXT1632(auVar191),ZEXT832(0) << 0x20,2);
        _local_820 = vblendvps_avx(ZEXT1632(auVar183),ZEXT1632(auVar8),auVar24);
        auVar146 = vblendvps_avx(ZEXT1632(auVar184),ZEXT1632(auVar11),auVar24);
        auVar137 = vblendvps_avx(ZEXT1632(auVar188),ZEXT1632(auVar12),auVar24);
        auVar135 = vblendvps_avx(auVar179,ZEXT1632(auVar13),auVar24);
        auVar153 = vblendvps_avx(ZEXT1632(auVar166),ZEXT1632(auVar14),auVar24);
        auVar22 = vblendvps_avx(auVar203,ZEXT1632(auVar9),auVar24);
        auVar179 = vblendvps_avx(ZEXT1632(auVar13),auVar179,auVar24);
        auVar23 = vblendvps_avx(ZEXT1632(auVar14),ZEXT1632(auVar166),auVar24);
        auVar191 = vpackssdw_avx(local_280._0_16_,local_280._16_16_);
        auVar203 = vblendvps_avx(ZEXT1632(auVar9),auVar203,auVar24);
        auVar156 = vsubps_avx(auVar179,_local_820);
        auVar23 = vsubps_avx(auVar23,auVar146);
        auVar148 = vsubps_avx(auVar203,auVar137);
        auVar21 = vsubps_avx(_local_820,auVar135);
        auVar175 = vsubps_avx(auVar146,auVar153);
        auVar176 = vsubps_avx(auVar137,auVar22);
        auVar50._4_4_ = auVar148._4_4_ * local_820._4_4_;
        auVar50._0_4_ = auVar148._0_4_ * local_820._0_4_;
        auVar50._8_4_ = auVar148._8_4_ * local_820._8_4_;
        auVar50._12_4_ = auVar148._12_4_ * local_820._12_4_;
        auVar50._16_4_ = auVar148._16_4_ * local_820._16_4_;
        auVar50._20_4_ = auVar148._20_4_ * local_820._20_4_;
        auVar50._24_4_ = auVar148._24_4_ * local_820._24_4_;
        auVar50._28_4_ = auVar203._28_4_;
        auVar8 = vfmsub231ps_fma(auVar50,auVar137,auVar156);
        auVar51._4_4_ = auVar156._4_4_ * auVar146._4_4_;
        auVar51._0_4_ = auVar156._0_4_ * auVar146._0_4_;
        auVar51._8_4_ = auVar156._8_4_ * auVar146._8_4_;
        auVar51._12_4_ = auVar156._12_4_ * auVar146._12_4_;
        auVar51._16_4_ = auVar156._16_4_ * auVar146._16_4_;
        auVar51._20_4_ = auVar156._20_4_ * auVar146._20_4_;
        auVar51._24_4_ = auVar156._24_4_ * auVar146._24_4_;
        auVar51._28_4_ = auVar179._28_4_;
        auVar9 = vfmsub231ps_fma(auVar51,_local_820,auVar23);
        auVar8 = vfmadd231ps_fma(ZEXT1632(auVar9),ZEXT832(0) << 0x20,ZEXT1632(auVar8));
        auVar132._0_4_ = auVar23._0_4_ * auVar137._0_4_;
        auVar132._4_4_ = auVar23._4_4_ * auVar137._4_4_;
        auVar132._8_4_ = auVar23._8_4_ * auVar137._8_4_;
        auVar132._12_4_ = auVar23._12_4_ * auVar137._12_4_;
        auVar132._16_4_ = auVar23._16_4_ * auVar137._16_4_;
        auVar132._20_4_ = auVar23._20_4_ * auVar137._20_4_;
        auVar132._24_4_ = auVar23._24_4_ * auVar137._24_4_;
        auVar132._28_4_ = 0;
        auVar9 = vfmsub231ps_fma(auVar132,auVar146,auVar148);
        auVar9 = vfmadd231ps_fma(ZEXT1632(auVar8),ZEXT832(0) << 0x20,ZEXT1632(auVar9));
        auVar133._0_4_ = auVar176._0_4_ * auVar135._0_4_;
        auVar133._4_4_ = auVar176._4_4_ * auVar135._4_4_;
        auVar133._8_4_ = auVar176._8_4_ * auVar135._8_4_;
        auVar133._12_4_ = auVar176._12_4_ * auVar135._12_4_;
        auVar133._16_4_ = auVar176._16_4_ * auVar135._16_4_;
        auVar133._20_4_ = auVar176._20_4_ * auVar135._20_4_;
        auVar133._24_4_ = auVar176._24_4_ * auVar135._24_4_;
        auVar133._28_4_ = 0;
        auVar8 = vfmsub231ps_fma(auVar133,auVar21,auVar22);
        auVar52._4_4_ = auVar175._4_4_ * auVar22._4_4_;
        auVar52._0_4_ = auVar175._0_4_ * auVar22._0_4_;
        auVar52._8_4_ = auVar175._8_4_ * auVar22._8_4_;
        auVar52._12_4_ = auVar175._12_4_ * auVar22._12_4_;
        auVar52._16_4_ = auVar175._16_4_ * auVar22._16_4_;
        auVar52._20_4_ = auVar175._20_4_ * auVar22._20_4_;
        auVar52._24_4_ = auVar175._24_4_ * auVar22._24_4_;
        auVar52._28_4_ = auVar22._28_4_;
        auVar10 = vfmsub231ps_fma(auVar52,auVar153,auVar176);
        auVar53._4_4_ = auVar21._4_4_ * auVar153._4_4_;
        auVar53._0_4_ = auVar21._0_4_ * auVar153._0_4_;
        auVar53._8_4_ = auVar21._8_4_ * auVar153._8_4_;
        auVar53._12_4_ = auVar21._12_4_ * auVar153._12_4_;
        auVar53._16_4_ = auVar21._16_4_ * auVar153._16_4_;
        auVar53._20_4_ = auVar21._20_4_ * auVar153._20_4_;
        auVar53._24_4_ = auVar21._24_4_ * auVar153._24_4_;
        auVar53._28_4_ = auVar153._28_4_;
        auVar11 = vfmsub231ps_fma(auVar53,auVar175,auVar135);
        auVar8 = vfmadd231ps_fma(ZEXT1632(auVar11),ZEXT832(0) << 0x20,ZEXT1632(auVar8));
        auVar10 = vfmadd231ps_fma(ZEXT1632(auVar8),ZEXT832(0) << 0x20,ZEXT1632(auVar10));
        auVar135 = vmaxps_avx(ZEXT1632(auVar9),ZEXT1632(auVar10));
        auVar135 = vcmpps_avx(auVar135,ZEXT832(0) << 0x20,2);
        auVar8 = vpackssdw_avx(auVar135._0_16_,auVar135._16_16_);
        auVar191 = vpand_avx(auVar191,auVar8);
        auVar135 = vpmovsxwd_avx2(auVar191);
        if ((((((((auVar135 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar135 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar135 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar135 >> 0x7f,0) == '\0') &&
              (auVar135 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar135 >> 0xbf,0) == '\0') &&
            (auVar135 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar135[0x1f]) {
LAB_019608a5:
          auVar211 = ZEXT3264(CONCAT824(uStack_508,
                                        CONCAT816(uStack_510,CONCAT88(uStack_518,local_520))));
          auVar218 = ZEXT3264(local_580);
          auVar181 = ZEXT3264(local_5a0);
        }
        else {
          auVar54._4_4_ = auVar23._4_4_ * auVar176._4_4_;
          auVar54._0_4_ = auVar23._0_4_ * auVar176._0_4_;
          auVar54._8_4_ = auVar23._8_4_ * auVar176._8_4_;
          auVar54._12_4_ = auVar23._12_4_ * auVar176._12_4_;
          auVar54._16_4_ = auVar23._16_4_ * auVar176._16_4_;
          auVar54._20_4_ = auVar23._20_4_ * auVar176._20_4_;
          auVar54._24_4_ = auVar23._24_4_ * auVar176._24_4_;
          auVar54._28_4_ = auVar135._28_4_;
          auVar13 = vfmsub231ps_fma(auVar54,auVar175,auVar148);
          auVar151._0_4_ = auVar21._0_4_ * auVar148._0_4_;
          auVar151._4_4_ = auVar21._4_4_ * auVar148._4_4_;
          auVar151._8_4_ = auVar21._8_4_ * auVar148._8_4_;
          auVar151._12_4_ = auVar21._12_4_ * auVar148._12_4_;
          auVar151._16_4_ = auVar21._16_4_ * auVar148._16_4_;
          auVar151._20_4_ = auVar21._20_4_ * auVar148._20_4_;
          auVar151._24_4_ = auVar21._24_4_ * auVar148._24_4_;
          auVar151._28_4_ = 0;
          auVar12 = vfmsub231ps_fma(auVar151,auVar156,auVar176);
          auVar55._4_4_ = auVar156._4_4_ * auVar175._4_4_;
          auVar55._0_4_ = auVar156._0_4_ * auVar175._0_4_;
          auVar55._8_4_ = auVar156._8_4_ * auVar175._8_4_;
          auVar55._12_4_ = auVar156._12_4_ * auVar175._12_4_;
          auVar55._16_4_ = auVar156._16_4_ * auVar175._16_4_;
          auVar55._20_4_ = auVar156._20_4_ * auVar175._20_4_;
          auVar55._24_4_ = auVar156._24_4_ * auVar175._24_4_;
          auVar55._28_4_ = auVar156._28_4_;
          auVar14 = vfmsub231ps_fma(auVar55,auVar21,auVar23);
          auVar8 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar12),ZEXT1632(auVar14));
          auVar11 = vfmadd231ps_fma(ZEXT1632(auVar8),ZEXT1632(auVar13),_DAT_02020f00);
          auVar135 = vrcpps_avx(ZEXT1632(auVar11));
          auVar221._8_4_ = 0x3f800000;
          auVar221._0_8_ = &DAT_3f8000003f800000;
          auVar221._12_4_ = 0x3f800000;
          auVar221._16_4_ = 0x3f800000;
          auVar221._20_4_ = 0x3f800000;
          auVar221._24_4_ = 0x3f800000;
          auVar221._28_4_ = 0x3f800000;
          auVar8 = vfnmadd213ps_fma(auVar135,ZEXT1632(auVar11),auVar221);
          auVar8 = vfmadd132ps_fma(ZEXT1632(auVar8),auVar135,auVar135);
          auVar56._4_4_ = auVar14._4_4_ * auVar137._4_4_;
          auVar56._0_4_ = auVar14._0_4_ * auVar137._0_4_;
          auVar56._8_4_ = auVar14._8_4_ * auVar137._8_4_;
          auVar56._12_4_ = auVar14._12_4_ * auVar137._12_4_;
          auVar56._16_4_ = auVar137._16_4_ * 0.0;
          auVar56._20_4_ = auVar137._20_4_ * 0.0;
          auVar56._24_4_ = auVar137._24_4_ * 0.0;
          auVar56._28_4_ = auVar137._28_4_;
          auVar12 = vfmadd231ps_fma(auVar56,auVar146,ZEXT1632(auVar12));
          auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),ZEXT1632(auVar13),_local_820);
          fVar140 = auVar8._0_4_;
          fVar141 = auVar8._4_4_;
          fVar142 = auVar8._8_4_;
          fVar143 = auVar8._12_4_;
          auVar57._28_4_ = auVar146._28_4_;
          auVar57._0_28_ =
               ZEXT1628(CONCAT412(fVar143 * auVar12._12_4_,
                                  CONCAT48(fVar142 * auVar12._8_4_,
                                           CONCAT44(fVar141 * auVar12._4_4_,fVar140 * auVar12._0_4_)
                                          )));
          auVar134._4_4_ = uVar119;
          auVar134._0_4_ = uVar119;
          auVar134._8_4_ = uVar119;
          auVar134._12_4_ = uVar119;
          auVar134._16_4_ = uVar119;
          auVar134._20_4_ = uVar119;
          auVar134._24_4_ = uVar119;
          auVar134._28_4_ = uVar119;
          fVar163 = (ray->super_RayK<1>).tfar;
          auVar152._4_4_ = fVar163;
          auVar152._0_4_ = fVar163;
          auVar152._8_4_ = fVar163;
          auVar152._12_4_ = fVar163;
          auVar152._16_4_ = fVar163;
          auVar152._20_4_ = fVar163;
          auVar152._24_4_ = fVar163;
          auVar152._28_4_ = fVar163;
          auVar146 = vcmpps_avx(auVar134,auVar57,2);
          auVar137 = vcmpps_avx(auVar57,auVar152,2);
          auVar146 = vandps_avx(auVar137,auVar146);
          auVar8 = vpackssdw_avx(auVar146._0_16_,auVar146._16_16_);
          auVar191 = vpand_avx(auVar191,auVar8);
          auVar146 = vpmovsxwd_avx2(auVar191);
          if ((((((((auVar146 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar146 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar146 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar146 >> 0x7f,0) == '\0') &&
                (auVar146 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar146 >> 0xbf,0) == '\0') &&
              (auVar146 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar146[0x1f]) goto LAB_019608a5;
          auVar146 = vcmpps_avx(ZEXT1632(auVar11),ZEXT832(0) << 0x20,4);
          auVar8 = vpackssdw_avx(auVar146._0_16_,auVar146._16_16_);
          auVar191 = vpand_avx(auVar191,auVar8);
          auVar146 = vpmovsxwd_avx2(auVar191);
          auVar211 = ZEXT3264(CONCAT824(uStack_508,
                                        CONCAT816(uStack_510,CONCAT88(uStack_518,local_520))));
          auVar218 = ZEXT3264(local_580);
          auVar181 = ZEXT3264(local_5a0);
          if ((((((((auVar146 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar146 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar146 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar146 >> 0x7f,0) != '\0') ||
                (auVar146 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar146 >> 0xbf,0) != '\0') ||
              (auVar146 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar146[0x1f] < '\0') {
            auVar135 = ZEXT1632(CONCAT412(fVar143 * auVar9._12_4_,
                                          CONCAT48(fVar142 * auVar9._8_4_,
                                                   CONCAT44(fVar141 * auVar9._4_4_,
                                                            fVar140 * auVar9._0_4_))));
            auVar153 = ZEXT1632(CONCAT412(fVar143 * auVar10._12_4_,
                                          CONCAT48(fVar142 * auVar10._8_4_,
                                                   CONCAT44(fVar141 * auVar10._4_4_,
                                                            fVar140 * auVar10._0_4_))));
            auVar198._8_4_ = 0x3f800000;
            auVar198._0_8_ = &DAT_3f8000003f800000;
            auVar198._12_4_ = 0x3f800000;
            auVar198._16_4_ = 0x3f800000;
            auVar198._20_4_ = 0x3f800000;
            auVar198._24_4_ = 0x3f800000;
            auVar198._28_4_ = 0x3f800000;
            auVar137 = vsubps_avx(auVar198,auVar135);
            auVar137 = vblendvps_avx(auVar137,auVar135,auVar24);
            auVar218 = ZEXT3264(auVar137);
            auVar137 = vsubps_avx(auVar198,auVar153);
            local_2a0 = vblendvps_avx(auVar137,auVar153,auVar24);
            auVar211 = ZEXT3264(auVar146);
            auVar181 = ZEXT3264(auVar57);
          }
        }
        local_580 = auVar218._0_32_;
        auVar235 = ZEXT3264(local_5c0);
        auVar251 = ZEXT3264(local_760);
        auVar222 = ZEXT3264(local_720);
        local_5a0 = auVar181._0_32_;
        auVar146 = auVar211._0_32_;
        if ((((((((auVar146 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar146 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar146 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar146 >> 0x7f,0) == '\0') &&
              (auVar211 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
             SUB321(auVar146 >> 0xbf,0) == '\0') &&
            (auVar211 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
            -1 < auVar211[0x1f]) {
          auVar211 = ZEXT3264(local_700);
          local_7d0 = auVar127;
          _local_6c0 = auVar164;
          local_6b0 = auVar128;
          local_6a0 = auVar165;
        }
        else {
          auVar137 = vsubps_avx(local_660,_local_5e0);
          auVar191 = vfmadd213ps_fma(auVar137,local_580,_local_5e0);
          fVar163 = local_7b8->depth_scale;
          auVar58._4_4_ = (auVar191._4_4_ + auVar191._4_4_) * fVar163;
          auVar58._0_4_ = (auVar191._0_4_ + auVar191._0_4_) * fVar163;
          auVar58._8_4_ = (auVar191._8_4_ + auVar191._8_4_) * fVar163;
          auVar58._12_4_ = (auVar191._12_4_ + auVar191._12_4_) * fVar163;
          auVar58._16_4_ = fVar163 * 0.0;
          auVar58._20_4_ = fVar163 * 0.0;
          auVar58._24_4_ = fVar163 * 0.0;
          auVar58._28_4_ = 0;
          auVar137 = vcmpps_avx(local_5a0,auVar58,6);
          auVar135 = auVar146 & auVar137;
          auVar211 = ZEXT3264(local_700);
          if ((((((((auVar135 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar135 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar135 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar135 >> 0x7f,0) == '\0') &&
                (auVar135 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar135 >> 0xbf,0) == '\0') &&
              (auVar135 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar135[0x1f]) goto LAB_0195f085;
          auVar146 = vandps_avx(auVar137,auVar146);
          auVar154._8_4_ = 0xbf800000;
          auVar154._0_8_ = 0xbf800000bf800000;
          auVar154._12_4_ = 0xbf800000;
          auVar154._16_4_ = 0xbf800000;
          auVar154._20_4_ = 0xbf800000;
          auVar154._24_4_ = 0xbf800000;
          auVar154._28_4_ = 0xbf800000;
          auVar178._8_4_ = 0x40000000;
          auVar178._0_8_ = 0x4000000040000000;
          auVar178._12_4_ = 0x40000000;
          auVar178._16_4_ = 0x40000000;
          auVar178._20_4_ = 0x40000000;
          auVar178._24_4_ = 0x40000000;
          auVar178._28_4_ = 0x40000000;
          auVar191 = vfmadd213ps_fma(local_2a0,auVar178,auVar154);
          local_400 = local_580;
          local_2a0 = ZEXT1632(auVar191);
          auVar137 = local_2a0;
          local_3e0 = ZEXT1632(auVar191);
          local_3c0 = local_5a0;
          local_3a0 = 0;
          local_39c = iVar17;
          local_390 = local_7d0._0_8_;
          uStack_388 = local_7d0._8_8_;
          local_380 = local_6a0._0_8_;
          uStack_378 = local_6a0._8_8_;
          local_370 = local_6b0._0_8_;
          uStack_368 = local_6b0._8_8_;
          local_360 = local_6c0;
          uStack_358 = uStack_6b8;
          local_340 = auVar146;
          local_7d0 = auVar127;
          _local_6c0 = auVar164;
          local_6b0 = auVar128;
          local_6a0 = auVar165;
          if ((pGVar123->mask & (ray->super_RayK<1>).mask) != 0) {
            local_560 = auVar146;
            fVar163 = 1.0 / auVar131._0_4_;
            local_320[0] = fVar163 * (auVar218._0_4_ + 0.0);
            local_320[1] = fVar163 * (auVar218._4_4_ + 1.0);
            local_320[2] = fVar163 * (auVar218._8_4_ + 2.0);
            local_320[3] = fVar163 * (auVar218._12_4_ + 3.0);
            fStack_310 = fVar163 * (auVar218._16_4_ + 4.0);
            fStack_30c = fVar163 * (auVar218._20_4_ + 5.0);
            fStack_308 = fVar163 * (auVar218._24_4_ + 6.0);
            fStack_304 = auVar218._28_4_ + 7.0;
            local_2a0._0_8_ = auVar191._0_8_;
            local_2a0._8_8_ = auVar191._8_8_;
            local_300 = local_2a0._0_8_;
            uStack_2f8 = local_2a0._8_8_;
            uStack_2f0 = 0;
            uStack_2e8 = 0;
            local_2e0 = local_5a0;
            auVar155._8_4_ = 0x7f800000;
            auVar155._0_8_ = 0x7f8000007f800000;
            auVar155._12_4_ = 0x7f800000;
            auVar155._16_4_ = 0x7f800000;
            auVar155._20_4_ = 0x7f800000;
            auVar155._24_4_ = 0x7f800000;
            auVar155._28_4_ = 0x7f800000;
            auVar135 = vblendvps_avx(auVar155,local_5a0,auVar146);
            auVar153 = vshufps_avx(auVar135,auVar135,0xb1);
            auVar153 = vminps_avx(auVar135,auVar153);
            auVar22 = vshufpd_avx(auVar153,auVar153,5);
            auVar153 = vminps_avx(auVar153,auVar22);
            auVar22 = vpermpd_avx2(auVar153,0x4e);
            auVar153 = vminps_avx(auVar153,auVar22);
            auVar135 = vcmpps_avx(auVar135,auVar153,0);
            auVar153 = auVar146 & auVar135;
            if ((((((((auVar153 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar153 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar153 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar153 >> 0x7f,0) != '\0') ||
                  (auVar153 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar153 >> 0xbf,0) != '\0') ||
                (auVar153 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar153[0x1f] < '\0') {
              auVar146 = vandps_avx(auVar135,auVar146);
            }
            uVar116 = vmovmskps_avx(auVar146);
            uVar119 = 0;
            for (; (uVar116 & 1) == 0; uVar116 = uVar116 >> 1 | 0x80000000) {
              uVar119 = uVar119 + 1;
            }
            auVar122 = (undefined1  [8])(ulong)uVar119;
            local_2a0 = auVar137;
            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
               (pGVar123->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
              fVar163 = local_320[(long)auVar122];
              fVar140 = *(float *)((long)&local_300 + (long)auVar122 * 4);
              fVar141 = 1.0 - fVar163;
              auVar191 = ZEXT416((uint)(fVar163 * fVar141 * 4.0));
              auVar8 = vfnmsub213ss_fma(ZEXT416((uint)fVar163),ZEXT416((uint)fVar163),auVar191);
              auVar191 = vfmadd213ss_fma(ZEXT416((uint)fVar141),ZEXT416((uint)fVar141),auVar191);
              fVar141 = fVar141 * -fVar141 * 0.5;
              fVar142 = auVar8._0_4_ * 0.5;
              fVar143 = auVar191._0_4_ * 0.5;
              fVar144 = fVar163 * fVar163 * 0.5;
              auVar189._0_4_ = fVar144 * (float)local_6c0._0_4_;
              auVar189._4_4_ = fVar144 * (float)local_6c0._4_4_;
              auVar189._8_4_ = fVar144 * (float)uStack_6b8;
              auVar189._12_4_ = fVar144 * uStack_6b8._4_4_;
              auVar167._4_4_ = fVar143;
              auVar167._0_4_ = fVar143;
              auVar167._8_4_ = fVar143;
              auVar167._12_4_ = fVar143;
              auVar191 = vfmadd132ps_fma(auVar167,auVar189,local_6b0);
              auVar190._4_4_ = fVar142;
              auVar190._0_4_ = fVar142;
              auVar190._8_4_ = fVar142;
              auVar190._12_4_ = fVar142;
              auVar191 = vfmadd132ps_fma(auVar190,auVar191,local_6a0);
              auVar168._4_4_ = fVar141;
              auVar168._0_4_ = fVar141;
              auVar168._8_4_ = fVar141;
              auVar168._12_4_ = fVar141;
              auVar191 = vfmadd132ps_fma(auVar168,auVar191,local_7d0);
              (ray->super_RayK<1>).tfar = *(float *)(local_2e0 + (long)auVar122 * 4);
              uVar4 = vmovlps_avx(auVar191);
              *(undefined8 *)&(ray->Ng).field_0 = uVar4;
              fVar141 = (float)vextractps_avx(auVar191,2);
              (ray->Ng).field_0.field_0.z = fVar141;
              ray->u = fVar163;
              ray->v = fVar140;
              ray->primID = uVar16;
              ray->geomID = uVar117;
              ray->instID[0] = context->user->instID[0];
              ray->instPrimID[0] = context->user->instPrimID[0];
              auVar153 = local_5a0;
              auVar146 = local_580;
            }
            else {
              _local_5e0 = ZEXT1632(local_6a0);
              local_660 = ZEXT1632(local_6b0);
              _local_4a0 = ZEXT1632(_local_6c0);
              do {
                local_684 = local_320[(long)auVar122];
                local_680 = *(undefined4 *)((long)&local_300 + (long)auVar122 * 4);
                local_780._0_4_ = (ray->super_RayK<1>).tfar;
                (ray->super_RayK<1>).tfar = *(float *)(local_2e0 + (long)auVar122 * 4);
                local_7b0.context = context->user;
                fVar163 = 1.0 - local_684;
                auVar191 = ZEXT416((uint)(local_684 * fVar163 * 4.0));
                auVar8 = vfnmsub213ss_fma(ZEXT416((uint)local_684),ZEXT416((uint)local_684),auVar191
                                         );
                auVar191 = vfmadd213ss_fma(ZEXT416((uint)fVar163),ZEXT416((uint)fVar163),auVar191);
                fVar163 = fVar163 * -fVar163 * 0.5;
                fVar140 = auVar8._0_4_ * 0.5;
                fVar141 = auVar191._0_4_ * 0.5;
                fVar142 = local_684 * local_684 * 0.5;
                auVar196._0_4_ = fVar142 * (float)local_4a0._0_4_;
                auVar196._4_4_ = fVar142 * (float)local_4a0._4_4_;
                auVar196._8_4_ = fVar142 * fStack_498;
                auVar196._12_4_ = fVar142 * fStack_494;
                auVar173._4_4_ = fVar141;
                auVar173._0_4_ = fVar141;
                auVar173._8_4_ = fVar141;
                auVar173._12_4_ = fVar141;
                auVar191 = vfmadd132ps_fma(auVar173,auVar196,local_660._0_16_);
                auVar197._4_4_ = fVar140;
                auVar197._0_4_ = fVar140;
                auVar197._8_4_ = fVar140;
                auVar197._12_4_ = fVar140;
                auVar191 = vfmadd132ps_fma(auVar197,auVar191,_local_5e0);
                auVar174._4_4_ = fVar163;
                auVar174._0_4_ = fVar163;
                auVar174._8_4_ = fVar163;
                auVar174._12_4_ = fVar163;
                auVar191 = vfmadd132ps_fma(auVar174,auVar191,local_7d0);
                local_690 = vmovlps_avx(auVar191);
                local_688 = vextractps_avx(auVar191,2);
                local_67c = (int)local_7d8;
                local_678 = (int)local_828;
                local_674 = (local_7b0.context)->instID[0];
                local_670 = (local_7b0.context)->instPrimID[0];
                local_82c = -1;
                local_7b0.valid = &local_82c;
                local_7b0.geometryUserPtr = pGVar123->userPtr;
                local_7b0.ray = (RTCRayN *)ray;
                local_7b0.hit = (RTCHitN *)&local_690;
                local_7b0.N = 1;
                local_820 = auVar122;
                if (pGVar123->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01960b32:
                  p_Var20 = context->args->filter;
                  if (p_Var20 != (RTCFilterFunctionN)0x0) {
                    if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                       (((pGVar123->field_8).field_0x2 & 0x40) != 0)) {
                      (*p_Var20)(&local_7b0);
                      auVar235 = ZEXT3264(local_5c0);
                      auVar211 = ZEXT3264(local_700);
                      auVar251 = ZEXT3264(local_760);
                      auVar222 = ZEXT3264(local_720);
                      auVar181 = ZEXT3264(local_5a0);
                      auVar218 = ZEXT3264(local_580);
                      auVar122 = local_820;
                      fVar223 = local_6e0;
                      fVar161 = fStack_6dc;
                      fVar237 = fStack_6d8;
                      fVar239 = fStack_6d4;
                      fVar240 = fStack_6d0;
                      fVar241 = fStack_6cc;
                      fVar242 = fStack_6c8;
                      fVar162 = (float)local_740;
                      fVar182 = local_740._4_4_;
                      fVar244 = (float)uStack_738;
                      fVar246 = uStack_738._4_4_;
                      fVar243 = (float)uStack_730;
                      fVar245 = uStack_730._4_4_;
                      fVar247 = (float)uStack_728;
                      fVar248 = uStack_728._4_4_;
                      uVar126 = local_620;
                      uVar229 = uStack_618;
                      uVar230 = uStack_610;
                      uVar231 = uStack_608;
                    }
                    if (*local_7b0.valid == 0) goto LAB_01960c2c;
                  }
                  (((Vec3f *)((long)local_7b0.ray + 0x30))->field_0).components[0] =
                       *(float *)local_7b0.hit;
                  (((Vec3f *)((long)local_7b0.ray + 0x30))->field_0).field_0.y =
                       *(float *)(local_7b0.hit + 4);
                  (((Vec3f *)((long)local_7b0.ray + 0x30))->field_0).field_0.z =
                       *(float *)(local_7b0.hit + 8);
                  *(float *)((long)local_7b0.ray + 0x3c) = *(float *)(local_7b0.hit + 0xc);
                  *(float *)((long)local_7b0.ray + 0x40) = *(float *)(local_7b0.hit + 0x10);
                  *(float *)((long)local_7b0.ray + 0x44) = *(float *)(local_7b0.hit + 0x14);
                  *(float *)((long)local_7b0.ray + 0x48) = *(float *)(local_7b0.hit + 0x18);
                  *(float *)((long)local_7b0.ray + 0x4c) = *(float *)(local_7b0.hit + 0x1c);
                  *(float *)((long)local_7b0.ray + 0x50) = *(float *)(local_7b0.hit + 0x20);
                }
                else {
                  (*pGVar123->intersectionFilterN)(&local_7b0);
                  auVar235 = ZEXT3264(local_5c0);
                  auVar211 = ZEXT3264(local_700);
                  auVar251 = ZEXT3264(local_760);
                  auVar222 = ZEXT3264(local_720);
                  auVar181 = ZEXT3264(local_5a0);
                  auVar218 = ZEXT3264(local_580);
                  auVar122 = local_820;
                  fVar223 = local_6e0;
                  fVar161 = fStack_6dc;
                  fVar237 = fStack_6d8;
                  fVar239 = fStack_6d4;
                  fVar240 = fStack_6d0;
                  fVar241 = fStack_6cc;
                  fVar242 = fStack_6c8;
                  fVar162 = (float)local_740;
                  fVar182 = local_740._4_4_;
                  fVar244 = (float)uStack_738;
                  fVar246 = uStack_738._4_4_;
                  fVar243 = (float)uStack_730;
                  fVar245 = uStack_730._4_4_;
                  fVar247 = (float)uStack_728;
                  fVar248 = uStack_728._4_4_;
                  uVar126 = local_620;
                  uVar229 = uStack_618;
                  uVar230 = uStack_610;
                  uVar231 = uStack_608;
                  if (*local_7b0.valid != 0) goto LAB_01960b32;
LAB_01960c2c:
                  (ray->super_RayK<1>).tfar = (float)local_780._0_4_;
                }
                *(undefined4 *)(local_560 + (long)auVar122 * 4) = 0;
                auVar135 = local_560;
                fVar163 = (ray->super_RayK<1>).tfar;
                auVar139._4_4_ = fVar163;
                auVar139._0_4_ = fVar163;
                auVar139._8_4_ = fVar163;
                auVar139._12_4_ = fVar163;
                auVar139._16_4_ = fVar163;
                auVar139._20_4_ = fVar163;
                auVar139._24_4_ = fVar163;
                auVar139._28_4_ = fVar163;
                auVar153 = auVar181._0_32_;
                auVar137 = vcmpps_avx(auVar153,auVar139,2);
                auVar146 = vandps_avx(auVar137,local_560);
                local_560 = auVar146;
                auVar135 = auVar135 & auVar137;
                bVar98 = (auVar135 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                bVar99 = (auVar135 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                bVar97 = (auVar135 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                bVar96 = SUB321(auVar135 >> 0x7f,0) != '\0';
                bVar95 = (auVar135 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                bVar94 = SUB321(auVar135 >> 0xbf,0) != '\0';
                bVar92 = (auVar135 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                bVar90 = auVar135[0x1f] < '\0';
                if (((((((bVar98 || bVar99) || bVar97) || bVar96) || bVar95) || bVar94) || bVar92)
                    || bVar90) {
                  auVar160._8_4_ = 0x7f800000;
                  auVar160._0_8_ = 0x7f8000007f800000;
                  auVar160._12_4_ = 0x7f800000;
                  auVar160._16_4_ = 0x7f800000;
                  auVar160._20_4_ = 0x7f800000;
                  auVar160._24_4_ = 0x7f800000;
                  auVar160._28_4_ = 0x7f800000;
                  auVar137 = vblendvps_avx(auVar160,auVar153,auVar146);
                  auVar135 = vshufps_avx(auVar137,auVar137,0xb1);
                  auVar135 = vminps_avx(auVar137,auVar135);
                  auVar22 = vshufpd_avx(auVar135,auVar135,5);
                  auVar135 = vminps_avx(auVar135,auVar22);
                  auVar22 = vpermpd_avx2(auVar135,0x4e);
                  auVar135 = vminps_avx(auVar135,auVar22);
                  auVar137 = vcmpps_avx(auVar137,auVar135,0);
                  auVar135 = auVar146 & auVar137;
                  if ((((((((auVar135 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar135 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar135 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar135 >> 0x7f,0) != '\0') ||
                        (auVar135 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar135 >> 0xbf,0) != '\0') ||
                      (auVar135 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar135[0x1f] < '\0') {
                    auVar146 = vandps_avx(auVar137,auVar146);
                  }
                  uVar117 = vmovmskps_avx(auVar146);
                  uVar119 = 0;
                  for (; (uVar117 & 1) == 0; uVar117 = uVar117 >> 1 | 0x80000000) {
                    uVar119 = uVar119 + 1;
                  }
                  auVar122 = (undefined1  [8])(ulong)uVar119;
                }
                auVar146 = auVar218._0_32_;
              } while (((((((bVar98 || bVar99) || bVar97) || bVar96) || bVar95) || bVar94) || bVar92
                       ) || bVar90);
            }
            local_580 = auVar146;
            local_5a0 = auVar153;
            auVar129 = local_800._0_16_;
          }
        }
        local_5c0 = auVar235._0_32_;
      }
      auVar181 = ZEXT1664(auVar129);
      if (8 < iVar17) {
        uStack_618 = uVar229;
        local_620 = uVar126;
        uStack_610 = uVar230;
        uStack_608 = uVar231;
        local_280._4_4_ = iVar17;
        local_280._0_4_ = iVar17;
        local_280._8_4_ = iVar17;
        local_280._12_4_ = iVar17;
        local_280._16_4_ = iVar17;
        local_280._20_4_ = iVar17;
        local_280._24_4_ = iVar17;
        local_280._28_4_ = iVar17;
        local_180 = auVar129._0_4_;
        uStack_17c = local_180;
        uStack_178 = local_180;
        uStack_174 = local_180;
        uStack_170 = local_180;
        uStack_16c = local_180;
        uStack_168 = local_180;
        uStack_164 = local_180;
        local_1a0 = local_640._0_4_;
        uStack_19c = local_640._0_4_;
        uStack_198 = local_640._0_4_;
        uStack_194 = local_640._0_4_;
        uStack_190 = local_640._0_4_;
        uStack_18c = local_640._0_4_;
        uStack_188 = local_640._0_4_;
        uStack_184 = local_640._0_4_;
        local_1c0 = 1.0 / (float)local_4c0._0_4_;
        fStack_1bc = local_1c0;
        fStack_1b8 = local_1c0;
        fStack_1b4 = local_1c0;
        fStack_1b0 = local_1c0;
        fStack_1ac = local_1c0;
        fStack_1a8 = local_1c0;
        fStack_1a4 = local_1c0;
        lVar120 = 8;
        do {
          auVar146 = *(undefined1 (*) [32])(bspline_basis0 + lVar120 * 4 + lVar25);
          local_800 = *(undefined1 (*) [32])(lVar25 + 0x222bfac + lVar120 * 4);
          auVar137 = *(undefined1 (*) [32])(lVar25 + 0x222c430 + lVar120 * 4);
          pauVar2 = (undefined1 (*) [32])(lVar25 + 0x222c8b4 + lVar120 * 4);
          fVar100 = *(float *)*pauVar2;
          fVar224 = *(float *)(*pauVar2 + 4);
          fVar228 = *(float *)(*pauVar2 + 8);
          fVar101 = *(float *)(*pauVar2 + 0xc);
          fVar102 = *(float *)(*pauVar2 + 0x10);
          fVar103 = *(float *)(*pauVar2 + 0x14);
          fVar104 = *(float *)(*pauVar2 + 0x18);
          auVar114 = *(undefined1 (*) [28])*pauVar2;
          auVar236._0_4_ = fVar100 * fVar223;
          auVar236._4_4_ = fVar224 * fVar161;
          auVar236._8_4_ = fVar228 * fVar237;
          auVar236._12_4_ = fVar101 * fVar239;
          auVar236._16_4_ = fVar102 * fVar240;
          auVar236._20_4_ = fVar103 * fVar241;
          auVar236._28_36_ = auVar235._28_36_;
          auVar236._24_4_ = fVar104 * fVar242;
          auVar218._0_4_ = fVar162 * fVar100;
          auVar218._4_4_ = fVar182 * fVar224;
          auVar218._8_4_ = fVar244 * fVar228;
          auVar218._12_4_ = fVar246 * fVar101;
          auVar218._16_4_ = fVar243 * fVar102;
          auVar218._20_4_ = fVar245 * fVar103;
          auVar218._28_36_ = auVar181._28_36_;
          auVar218._24_4_ = fVar247 * fVar104;
          auVar191 = vfmadd231ps_fma(auVar236._0_32_,auVar137,local_600);
          auVar8 = vfmadd231ps_fma(auVar218._0_32_,auVar137,auVar222._0_32_);
          auVar191 = vfmadd231ps_fma(ZEXT1632(auVar191),local_800,auVar251._0_32_);
          auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),local_800,local_440);
          auVar191 = vfmadd231ps_fma(ZEXT1632(auVar191),auVar146,auVar211._0_32_);
          auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar146,local_460);
          auVar135 = *(undefined1 (*) [32])(bspline_basis1 + lVar120 * 4 + lVar25);
          auVar153 = *(undefined1 (*) [32])(lVar25 + 0x222e3cc + lVar120 * 4);
          auVar22 = *(undefined1 (*) [32])(lVar25 + 0x222e850 + lVar120 * 4);
          pfVar1 = (float *)(lVar25 + 0x222ecd4 + lVar120 * 4);
          fVar105 = *pfVar1;
          fVar106 = pfVar1[1];
          fVar107 = pfVar1[2];
          fVar108 = pfVar1[3];
          fVar109 = pfVar1[4];
          fVar110 = pfVar1[5];
          fVar111 = pfVar1[6];
          auVar181._0_4_ = fVar105 * fVar223;
          auVar181._4_4_ = fVar106 * fVar161;
          auVar181._8_4_ = fVar107 * fVar237;
          auVar181._12_4_ = fVar108 * fVar239;
          auVar181._16_4_ = fVar109 * fVar240;
          auVar181._20_4_ = fVar110 * fVar241;
          auVar181._28_36_ = auVar211._28_36_;
          auVar181._24_4_ = fVar111 * fVar242;
          auVar59._4_4_ = fVar106 * fVar182;
          auVar59._0_4_ = fVar105 * fVar162;
          auVar59._8_4_ = fVar107 * fVar244;
          auVar59._12_4_ = fVar108 * fVar246;
          auVar59._16_4_ = fVar109 * fVar243;
          auVar59._20_4_ = fVar110 * fVar245;
          auVar59._24_4_ = fVar111 * fVar247;
          auVar59._28_4_ = fVar248;
          auVar9 = vfmadd231ps_fma(auVar181._0_32_,auVar22,local_600);
          auVar10 = vfmadd231ps_fma(auVar59,auVar22,auVar222._0_32_);
          auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar153,auVar251._0_32_);
          auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar153,local_440);
          auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar135,auVar211._0_32_);
          auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar135,local_460);
          local_260 = ZEXT1632(auVar9);
          local_660 = ZEXT1632(auVar191);
          local_220 = vsubps_avx(local_260,local_660);
          _local_5e0 = ZEXT1632(auVar10);
          local_640 = ZEXT1632(auVar8);
          _local_4a0 = vsubps_avx(_local_5e0,local_640);
          auVar93._4_4_ = auVar8._4_4_ * local_220._4_4_;
          auVar93._0_4_ = auVar8._0_4_ * local_220._0_4_;
          auVar93._8_4_ = auVar8._8_4_ * local_220._8_4_;
          auVar93._12_4_ = auVar8._12_4_ * local_220._12_4_;
          auVar93._16_4_ = local_220._16_4_ * 0.0;
          auVar93._20_4_ = local_220._20_4_ * 0.0;
          auVar93._24_4_ = local_220._24_4_ * 0.0;
          auVar93._28_4_ = local_460._28_4_;
          fVar163 = local_4a0._0_4_;
          fVar140 = local_4a0._4_4_;
          auVar91._4_4_ = auVar191._4_4_ * fVar140;
          auVar91._0_4_ = auVar191._0_4_ * fVar163;
          fVar141 = local_4a0._8_4_;
          auVar91._8_4_ = auVar191._8_4_ * fVar141;
          fVar142 = local_4a0._12_4_;
          auVar91._12_4_ = auVar191._12_4_ * fVar142;
          fVar143 = local_4a0._16_4_;
          auVar91._16_4_ = fVar143 * 0.0;
          fVar144 = local_4a0._20_4_;
          auVar91._20_4_ = fVar144 * 0.0;
          fVar145 = local_4a0._24_4_;
          auVar91._24_4_ = fVar145 * 0.0;
          auVar91._28_4_ = local_600._28_4_;
          auVar23 = vsubps_avx(auVar93,auVar91);
          _local_240 = *pauVar2;
          auVar24 = _local_240;
          auVar60._4_4_ = fVar224 * local_100._4_4_;
          auVar60._0_4_ = fVar100 * (float)local_100;
          auVar60._8_4_ = fVar228 * (float)uStack_f8;
          auVar60._12_4_ = fVar101 * uStack_f8._4_4_;
          auVar60._16_4_ = fVar102 * (float)uStack_f0;
          auVar60._20_4_ = fVar103 * uStack_f0._4_4_;
          auVar60._24_4_ = fVar104 * (float)uStack_e8;
          auVar60._28_4_ = local_600._28_4_;
          auVar235 = ZEXT3264(local_e0);
          auVar8 = vfmadd231ps_fma(auVar60,local_e0,auVar137);
          auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),local_c0,local_800);
          auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),local_a0,auVar146);
          auVar61._4_4_ = fVar106 * local_100._4_4_;
          auVar61._0_4_ = fVar105 * (float)local_100;
          auVar61._8_4_ = fVar107 * (float)uStack_f8;
          auVar61._12_4_ = fVar108 * uStack_f8._4_4_;
          auVar61._16_4_ = fVar109 * (float)uStack_f0;
          auVar61._20_4_ = fVar110 * uStack_f0._4_4_;
          auVar61._24_4_ = fVar111 * (float)uStack_e8;
          auVar61._28_4_ = uStack_e8._4_4_;
          auVar9 = vfmadd231ps_fma(auVar61,auVar22,local_e0);
          auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar153,local_c0);
          auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar135,local_a0);
          auVar181 = ZEXT1664(auVar9);
          auVar62._4_4_ = fVar140 * fVar140;
          auVar62._0_4_ = fVar163 * fVar163;
          auVar62._8_4_ = fVar141 * fVar141;
          auVar62._12_4_ = fVar142 * fVar142;
          auVar62._16_4_ = fVar143 * fVar143;
          auVar62._20_4_ = fVar144 * fVar144;
          auVar62._24_4_ = fVar145 * fVar145;
          auVar62._28_4_ = *(undefined4 *)(*pauVar2 + 0x1c);
          auVar10 = vfmadd231ps_fma(auVar62,local_220,local_220);
          auVar156 = ZEXT1632(auVar8);
          local_480 = ZEXT1632(auVar9);
          auVar179 = vmaxps_avx(auVar156,local_480);
          auVar216._0_4_ = auVar179._0_4_ * auVar179._0_4_ * auVar10._0_4_;
          auVar216._4_4_ = auVar179._4_4_ * auVar179._4_4_ * auVar10._4_4_;
          auVar216._8_4_ = auVar179._8_4_ * auVar179._8_4_ * auVar10._8_4_;
          auVar216._12_4_ = auVar179._12_4_ * auVar179._12_4_ * auVar10._12_4_;
          auVar216._16_4_ = auVar179._16_4_ * auVar179._16_4_ * 0.0;
          auVar216._20_4_ = auVar179._20_4_ * auVar179._20_4_ * 0.0;
          auVar216._24_4_ = auVar179._24_4_ * auVar179._24_4_ * 0.0;
          auVar216._28_4_ = 0;
          auVar63._4_4_ = auVar23._4_4_ * auVar23._4_4_;
          auVar63._0_4_ = auVar23._0_4_ * auVar23._0_4_;
          auVar63._8_4_ = auVar23._8_4_ * auVar23._8_4_;
          auVar63._12_4_ = auVar23._12_4_ * auVar23._12_4_;
          auVar63._16_4_ = auVar23._16_4_ * auVar23._16_4_;
          auVar63._20_4_ = auVar23._20_4_ * auVar23._20_4_;
          auVar63._24_4_ = auVar23._24_4_ * auVar23._24_4_;
          auVar63._28_4_ = auVar23._28_4_;
          auVar179 = vcmpps_avx(auVar63,auVar216,2);
          local_3a0 = (int)lVar120;
          auVar217._4_4_ = local_3a0;
          auVar217._0_4_ = local_3a0;
          auVar217._8_4_ = local_3a0;
          auVar217._12_4_ = local_3a0;
          auVar217._16_4_ = local_3a0;
          auVar217._20_4_ = local_3a0;
          auVar217._24_4_ = local_3a0;
          auVar217._28_4_ = local_3a0;
          auVar23 = vpor_avx2(auVar217,_DAT_0205a920);
          auVar203 = vpcmpgtd_avx2(local_280,auVar23);
          auVar23 = auVar203 & auVar179;
          fVar223 = local_6e0;
          fVar161 = fStack_6dc;
          fVar237 = fStack_6d8;
          fVar239 = fStack_6d4;
          fVar240 = fStack_6d0;
          fVar241 = fStack_6cc;
          fVar242 = fStack_6c8;
          fVar162 = (float)local_740;
          fVar182 = local_740._4_4_;
          fVar244 = (float)uStack_738;
          fVar246 = uStack_738._4_4_;
          fVar243 = (float)uStack_730;
          fVar245 = uStack_730._4_4_;
          fVar247 = (float)uStack_728;
          fVar248 = uStack_728._4_4_;
          if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar23 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar23 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar23 >> 0x7f,0) == '\0') &&
                (auVar23 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar23 >> 0xbf,0) == '\0') &&
              (auVar23 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar23[0x1f]) {
LAB_019601e1:
            auVar251 = ZEXT3264(local_760);
            auVar222 = ZEXT3264(local_720);
            auVar211 = ZEXT3264(local_700);
          }
          else {
            local_120 = vandps_avx(auVar203,auVar179);
            auVar64._4_4_ = local_620._4_4_ * fVar106;
            auVar64._0_4_ = (float)local_620 * fVar105;
            auVar64._8_4_ = (float)uStack_618 * fVar107;
            auVar64._12_4_ = uStack_618._4_4_ * fVar108;
            auVar64._16_4_ = (float)uStack_610 * fVar109;
            auVar64._20_4_ = uStack_610._4_4_ * fVar110;
            auVar64._24_4_ = (float)uStack_608 * fVar111;
            auVar64._28_4_ = auVar179._28_4_;
            auVar8 = vfmadd213ps_fma(auVar22,local_420,auVar64);
            local_4c0 = auVar156;
            auVar8 = vfmadd213ps_fma(auVar153,local_5c0,ZEXT1632(auVar8));
            auVar8 = vfmadd213ps_fma(auVar135,local_500,ZEXT1632(auVar8));
            local_140 = ZEXT1632(auVar8);
            local_240._0_4_ = auVar114._0_4_;
            local_240._4_4_ = auVar114._4_4_;
            fStack_238 = auVar114._8_4_;
            fStack_234 = auVar114._12_4_;
            fStack_230 = auVar114._16_4_;
            fStack_22c = auVar114._20_4_;
            fStack_228 = auVar114._24_4_;
            auVar65._4_4_ = local_620._4_4_ * (float)local_240._4_4_;
            auVar65._0_4_ = (float)local_620 * (float)local_240._0_4_;
            auVar65._8_4_ = (float)uStack_618 * fStack_238;
            auVar65._12_4_ = uStack_618._4_4_ * fStack_234;
            auVar65._16_4_ = (float)uStack_610 * fStack_230;
            auVar65._20_4_ = uStack_610._4_4_ * fStack_22c;
            auVar65._24_4_ = (float)uStack_608 * fStack_228;
            auVar65._28_4_ = auVar179._28_4_;
            auVar8 = vfmadd213ps_fma(auVar137,local_420,auVar65);
            auVar8 = vfmadd213ps_fma(local_800,local_5c0,ZEXT1632(auVar8));
            auVar137 = *(undefined1 (*) [32])(lVar25 + 0x222cd38 + lVar120 * 4);
            auVar135 = *(undefined1 (*) [32])(lVar25 + 0x222d1bc + lVar120 * 4);
            auVar153 = *(undefined1 (*) [32])(lVar25 + 0x222d640 + lVar120 * 4);
            pfVar3 = (float *)(lVar25 + 0x222dac4 + lVar120 * 4);
            fVar163 = *pfVar3;
            fVar140 = pfVar3[1];
            fVar141 = pfVar3[2];
            fVar142 = pfVar3[3];
            fVar143 = pfVar3[4];
            fVar144 = pfVar3[5];
            fVar145 = pfVar3[6];
            auVar66._4_4_ = fVar140 * fStack_6dc;
            auVar66._0_4_ = fVar163 * local_6e0;
            auVar66._8_4_ = fVar141 * fStack_6d8;
            auVar66._12_4_ = fVar142 * fStack_6d4;
            auVar66._16_4_ = fVar143 * fStack_6d0;
            auVar66._20_4_ = fVar144 * fStack_6cc;
            auVar66._24_4_ = fVar145 * fStack_6c8;
            auVar66._28_4_ = pfVar1[7];
            auVar226._0_4_ = (float)local_740 * fVar163;
            auVar226._4_4_ = local_740._4_4_ * fVar140;
            auVar226._8_4_ = (float)uStack_738 * fVar141;
            auVar226._12_4_ = uStack_738._4_4_ * fVar142;
            auVar226._16_4_ = (float)uStack_730 * fVar143;
            auVar226._20_4_ = uStack_730._4_4_ * fVar144;
            auVar226._24_4_ = (float)uStack_728 * fVar145;
            auVar226._28_4_ = 0;
            auVar67._4_4_ = fVar140 * local_620._4_4_;
            auVar67._0_4_ = fVar163 * (float)local_620;
            auVar67._8_4_ = fVar141 * (float)uStack_618;
            auVar67._12_4_ = fVar142 * uStack_618._4_4_;
            auVar67._16_4_ = fVar143 * (float)uStack_610;
            auVar67._20_4_ = fVar144 * uStack_610._4_4_;
            auVar67._24_4_ = fVar145 * (float)uStack_608;
            auVar67._28_4_ = pfVar3[7];
            auVar9 = vfmadd231ps_fma(auVar66,auVar153,local_600);
            auVar10 = vfmadd231ps_fma(auVar226,auVar153,local_720);
            auVar129 = vfmadd231ps_fma(auVar67,local_420,auVar153);
            auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar135,local_760);
            auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar135,local_440);
            auVar129 = vfmadd231ps_fma(ZEXT1632(auVar129),local_5c0,auVar135);
            auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar137,local_700);
            auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar137,local_460);
            auVar129 = vfmadd231ps_fma(ZEXT1632(auVar129),local_500,auVar137);
            pfVar1 = (float *)(lVar25 + 0x222fee4 + lVar120 * 4);
            fVar163 = *pfVar1;
            fVar140 = pfVar1[1];
            fVar141 = pfVar1[2];
            fVar142 = pfVar1[3];
            fVar143 = pfVar1[4];
            fVar144 = pfVar1[5];
            fVar145 = pfVar1[6];
            auVar68._4_4_ = fStack_6dc * fVar140;
            auVar68._0_4_ = local_6e0 * fVar163;
            auVar68._8_4_ = fStack_6d8 * fVar141;
            auVar68._12_4_ = fStack_6d4 * fVar142;
            auVar68._16_4_ = fStack_6d0 * fVar143;
            auVar68._20_4_ = fStack_6cc * fVar144;
            auVar68._24_4_ = fStack_6c8 * fVar145;
            auVar68._28_4_ = local_500._28_4_;
            auVar69._4_4_ = local_740._4_4_ * fVar140;
            auVar69._0_4_ = (float)local_740 * fVar163;
            auVar69._8_4_ = (float)uStack_738 * fVar141;
            auVar69._12_4_ = uStack_738._4_4_ * fVar142;
            auVar69._16_4_ = (float)uStack_730 * fVar143;
            auVar69._20_4_ = uStack_730._4_4_ * fVar144;
            auVar69._24_4_ = (float)uStack_728 * fVar145;
            auVar69._28_4_ = uStack_728._4_4_;
            auVar70._4_4_ = local_620._4_4_ * fVar140;
            auVar70._0_4_ = (float)local_620 * fVar163;
            auVar70._8_4_ = (float)uStack_618 * fVar141;
            auVar70._12_4_ = uStack_618._4_4_ * fVar142;
            auVar70._16_4_ = (float)uStack_610 * fVar143;
            auVar70._20_4_ = uStack_610._4_4_ * fVar144;
            auVar70._24_4_ = (float)uStack_608 * fVar145;
            auVar70._28_4_ = pfVar1[7];
            auVar137 = *(undefined1 (*) [32])(lVar25 + 0x222fa60 + lVar120 * 4);
            auVar11 = vfmadd231ps_fma(auVar68,auVar137,local_600);
            auVar12 = vfmadd231ps_fma(auVar69,auVar137,local_720);
            auVar13 = vfmadd231ps_fma(auVar70,local_420,auVar137);
            auVar137 = *(undefined1 (*) [32])(lVar25 + 0x222f5dc + lVar120 * 4);
            auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar137,local_760);
            auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar137,local_440);
            auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar137,local_5c0);
            auVar137 = *(undefined1 (*) [32])(lVar25 + 0x222f158 + lVar120 * 4);
            auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar137,local_700);
            auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar137,local_460);
            auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),local_500,auVar137);
            auVar137 = vandps_avx(ZEXT1632(auVar9),local_1e0);
            auVar135 = vandps_avx(ZEXT1632(auVar10),local_1e0);
            auVar135 = vmaxps_avx(auVar137,auVar135);
            auVar137 = vandps_avx(ZEXT1632(auVar129),local_1e0);
            auVar137 = vmaxps_avx(auVar135,auVar137);
            auVar113._4_4_ = uStack_17c;
            auVar113._0_4_ = local_180;
            auVar113._8_4_ = uStack_178;
            auVar113._12_4_ = uStack_174;
            auVar113._16_4_ = uStack_170;
            auVar113._20_4_ = uStack_16c;
            auVar113._24_4_ = uStack_168;
            auVar113._28_4_ = uStack_164;
            auVar137 = vcmpps_avx(auVar137,auVar113,1);
            auVar153 = vblendvps_avx(ZEXT1632(auVar9),local_220,auVar137);
            auVar22 = vblendvps_avx(ZEXT1632(auVar10),_local_4a0,auVar137);
            auVar137 = vandps_avx(ZEXT1632(auVar11),local_1e0);
            auVar135 = vandps_avx(ZEXT1632(auVar12),local_1e0);
            auVar135 = vmaxps_avx(auVar137,auVar135);
            auVar137 = vandps_avx(local_1e0,ZEXT1632(auVar13));
            auVar137 = vmaxps_avx(auVar135,auVar137);
            auVar135 = vcmpps_avx(auVar137,auVar113,1);
            auVar137 = vblendvps_avx(ZEXT1632(auVar11),local_220,auVar135);
            auVar135 = vblendvps_avx(ZEXT1632(auVar12),_local_4a0,auVar135);
            auVar8 = vfmadd213ps_fma(auVar146,local_500,ZEXT1632(auVar8));
            auVar9 = vfmadd213ps_fma(auVar153,auVar153,ZEXT832(0) << 0x20);
            auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar22,auVar22);
            auVar146 = vrsqrtps_avx(ZEXT1632(auVar9));
            fVar163 = auVar146._0_4_;
            fVar140 = auVar146._4_4_;
            fVar141 = auVar146._8_4_;
            fVar142 = auVar146._12_4_;
            fVar143 = auVar146._16_4_;
            fVar144 = auVar146._20_4_;
            fVar145 = auVar146._24_4_;
            auVar71._4_4_ = fVar140 * fVar140 * fVar140 * auVar9._4_4_ * -0.5;
            auVar71._0_4_ = fVar163 * fVar163 * fVar163 * auVar9._0_4_ * -0.5;
            auVar71._8_4_ = fVar141 * fVar141 * fVar141 * auVar9._8_4_ * -0.5;
            auVar71._12_4_ = fVar142 * fVar142 * fVar142 * auVar9._12_4_ * -0.5;
            auVar71._16_4_ = fVar143 * fVar143 * fVar143 * -0.0;
            auVar71._20_4_ = fVar144 * fVar144 * fVar144 * -0.0;
            auVar71._24_4_ = fVar145 * fVar145 * fVar145 * -0.0;
            auVar71._28_4_ = 0;
            auVar238._8_4_ = 0x3fc00000;
            auVar238._0_8_ = 0x3fc000003fc00000;
            auVar238._12_4_ = 0x3fc00000;
            auVar238._16_4_ = 0x3fc00000;
            auVar238._20_4_ = 0x3fc00000;
            auVar238._24_4_ = 0x3fc00000;
            auVar238._28_4_ = 0x3fc00000;
            auVar9 = vfmadd231ps_fma(auVar71,auVar238,auVar146);
            fVar163 = auVar9._0_4_;
            fVar140 = auVar9._4_4_;
            auVar72._4_4_ = auVar22._4_4_ * fVar140;
            auVar72._0_4_ = auVar22._0_4_ * fVar163;
            fVar141 = auVar9._8_4_;
            auVar72._8_4_ = auVar22._8_4_ * fVar141;
            fVar142 = auVar9._12_4_;
            auVar72._12_4_ = auVar22._12_4_ * fVar142;
            auVar72._16_4_ = auVar22._16_4_ * 0.0;
            auVar72._20_4_ = auVar22._20_4_ * 0.0;
            auVar72._24_4_ = auVar22._24_4_ * 0.0;
            auVar72._28_4_ = auVar22._28_4_;
            auVar73._4_4_ = fVar140 * -auVar153._4_4_;
            auVar73._0_4_ = fVar163 * -auVar153._0_4_;
            auVar73._8_4_ = fVar141 * -auVar153._8_4_;
            auVar73._12_4_ = fVar142 * -auVar153._12_4_;
            auVar73._16_4_ = -auVar153._16_4_ * 0.0;
            auVar73._20_4_ = -auVar153._20_4_ * 0.0;
            auVar73._24_4_ = -auVar153._24_4_ * 0.0;
            auVar73._28_4_ = auVar146._28_4_;
            auVar9 = vfmadd213ps_fma(auVar137,auVar137,ZEXT832(0) << 0x20);
            auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar135,auVar135);
            auVar146 = vrsqrtps_avx(ZEXT1632(auVar9));
            auVar74._28_4_ = local_460._28_4_;
            auVar74._0_28_ =
                 ZEXT1628(CONCAT412(fVar142 * 0.0,
                                    CONCAT48(fVar141 * 0.0,CONCAT44(fVar140 * 0.0,fVar163 * 0.0))));
            fVar163 = auVar146._0_4_;
            fVar140 = auVar146._4_4_;
            fVar141 = auVar146._8_4_;
            fVar142 = auVar146._12_4_;
            fVar143 = auVar146._16_4_;
            fVar144 = auVar146._20_4_;
            fVar145 = auVar146._24_4_;
            auVar75._4_4_ = fVar140 * fVar140 * fVar140 * auVar9._4_4_ * -0.5;
            auVar75._0_4_ = fVar163 * fVar163 * fVar163 * auVar9._0_4_ * -0.5;
            auVar75._8_4_ = fVar141 * fVar141 * fVar141 * auVar9._8_4_ * -0.5;
            auVar75._12_4_ = fVar142 * fVar142 * fVar142 * auVar9._12_4_ * -0.5;
            auVar75._16_4_ = fVar143 * fVar143 * fVar143 * -0.0;
            auVar75._20_4_ = fVar144 * fVar144 * fVar144 * -0.0;
            auVar75._24_4_ = fVar145 * fVar145 * fVar145 * -0.0;
            auVar75._28_4_ = 0;
            auVar9 = vfmadd231ps_fma(auVar75,auVar238,auVar146);
            fVar163 = auVar9._0_4_;
            fVar140 = auVar9._4_4_;
            auVar76._4_4_ = auVar135._4_4_ * fVar140;
            auVar76._0_4_ = auVar135._0_4_ * fVar163;
            fVar141 = auVar9._8_4_;
            auVar76._8_4_ = auVar135._8_4_ * fVar141;
            fVar142 = auVar9._12_4_;
            auVar76._12_4_ = auVar135._12_4_ * fVar142;
            auVar76._16_4_ = auVar135._16_4_ * 0.0;
            auVar76._20_4_ = auVar135._20_4_ * 0.0;
            auVar76._24_4_ = auVar135._24_4_ * 0.0;
            auVar76._28_4_ = 0;
            auVar77._4_4_ = fVar140 * -auVar137._4_4_;
            auVar77._0_4_ = fVar163 * -auVar137._0_4_;
            auVar77._8_4_ = fVar141 * -auVar137._8_4_;
            auVar77._12_4_ = fVar142 * -auVar137._12_4_;
            auVar77._16_4_ = -auVar137._16_4_ * 0.0;
            auVar77._20_4_ = -auVar137._20_4_ * 0.0;
            auVar77._24_4_ = -auVar137._24_4_ * 0.0;
            auVar77._28_4_ = auVar146._28_4_;
            auVar78._28_4_ = 0xbf000000;
            auVar78._0_28_ =
                 ZEXT1628(CONCAT412(fVar142 * 0.0,
                                    CONCAT48(fVar141 * 0.0,CONCAT44(fVar140 * 0.0,fVar163 * 0.0))));
            auVar9 = vfmadd213ps_fma(auVar72,auVar156,local_660);
            auVar10 = vfmadd213ps_fma(auVar73,auVar156,local_640);
            auVar129 = vfmadd213ps_fma(auVar74,auVar156,ZEXT1632(auVar8));
            auVar127 = vfnmadd213ps_fma(auVar72,auVar156,local_660);
            auVar11 = vfmadd213ps_fma(auVar76,local_480,local_260);
            auVar164 = vfnmadd213ps_fma(auVar73,auVar156,local_640);
            auVar12 = vfmadd213ps_fma(auVar77,local_480,_local_5e0);
            auVar8 = vfnmadd231ps_fma(ZEXT1632(auVar8),auVar156,auVar74);
            auVar13 = vfmadd213ps_fma(auVar78,local_480,local_140);
            auVar26 = vfnmadd213ps_fma(auVar76,local_480,local_260);
            auVar128 = vfnmadd213ps_fma(auVar77,local_480,_local_5e0);
            auVar165 = vfnmadd231ps_fma(local_140,local_480,auVar78);
            auVar146 = vsubps_avx(ZEXT1632(auVar12),ZEXT1632(auVar164));
            auVar137 = vsubps_avx(ZEXT1632(auVar13),ZEXT1632(auVar8));
            auVar79._4_4_ = auVar146._4_4_ * auVar8._4_4_;
            auVar79._0_4_ = auVar146._0_4_ * auVar8._0_4_;
            auVar79._8_4_ = auVar146._8_4_ * auVar8._8_4_;
            auVar79._12_4_ = auVar146._12_4_ * auVar8._12_4_;
            auVar79._16_4_ = auVar146._16_4_ * 0.0;
            auVar79._20_4_ = auVar146._20_4_ * 0.0;
            auVar79._24_4_ = auVar146._24_4_ * 0.0;
            auVar79._28_4_ = local_220._28_4_;
            auVar14 = vfmsub231ps_fma(auVar79,ZEXT1632(auVar164),auVar137);
            auVar80._4_4_ = auVar127._4_4_ * auVar137._4_4_;
            auVar80._0_4_ = auVar127._0_4_ * auVar137._0_4_;
            auVar80._8_4_ = auVar127._8_4_ * auVar137._8_4_;
            auVar80._12_4_ = auVar127._12_4_ * auVar137._12_4_;
            auVar80._16_4_ = auVar137._16_4_ * 0.0;
            auVar80._20_4_ = auVar137._20_4_ * 0.0;
            auVar80._24_4_ = auVar137._24_4_ * 0.0;
            auVar80._28_4_ = auVar137._28_4_;
            auVar153 = ZEXT1632(auVar127);
            auVar137 = vsubps_avx(ZEXT1632(auVar11),auVar153);
            auVar179 = ZEXT1632(auVar8);
            auVar8 = vfmsub231ps_fma(auVar80,auVar179,auVar137);
            auVar81._4_4_ = auVar164._4_4_ * auVar137._4_4_;
            auVar81._0_4_ = auVar164._0_4_ * auVar137._0_4_;
            auVar81._8_4_ = auVar164._8_4_ * auVar137._8_4_;
            auVar81._12_4_ = auVar164._12_4_ * auVar137._12_4_;
            auVar81._16_4_ = auVar137._16_4_ * 0.0;
            auVar81._20_4_ = auVar137._20_4_ * 0.0;
            auVar81._24_4_ = auVar137._24_4_ * 0.0;
            auVar81._28_4_ = auVar137._28_4_;
            auVar127 = vfmsub231ps_fma(auVar81,auVar153,auVar146);
            auVar8 = vfmadd231ps_fma(ZEXT1632(auVar127),ZEXT832(0) << 0x20,ZEXT1632(auVar8));
            auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),ZEXT832(0) << 0x20,ZEXT1632(auVar14));
            auVar23 = vcmpps_avx(ZEXT1632(auVar8),ZEXT832(0) << 0x20,2);
            local_780 = vblendvps_avx(ZEXT1632(auVar26),ZEXT1632(auVar9),auVar23);
            _local_820 = vblendvps_avx(ZEXT1632(auVar128),ZEXT1632(auVar10),auVar23);
            local_640 = vblendvps_avx(ZEXT1632(auVar165),ZEXT1632(auVar129),auVar23);
            auVar146 = vblendvps_avx(auVar153,ZEXT1632(auVar11),auVar23);
            auVar137 = vblendvps_avx(ZEXT1632(auVar164),ZEXT1632(auVar12),auVar23);
            auVar135 = vblendvps_avx(auVar179,ZEXT1632(auVar13),auVar23);
            auVar153 = vblendvps_avx(ZEXT1632(auVar11),auVar153,auVar23);
            auVar22 = vblendvps_avx(ZEXT1632(auVar12),ZEXT1632(auVar164),auVar23);
            auVar8 = vpackssdw_avx(local_120._0_16_,local_120._16_16_);
            local_800 = ZEXT1632(auVar8);
            auVar179 = vblendvps_avx(ZEXT1632(auVar13),auVar179,auVar23);
            auVar153 = vsubps_avx(auVar153,local_780);
            auVar22 = vsubps_avx(auVar22,_local_820);
            auVar203 = vsubps_avx(auVar179,local_640);
            auVar148 = vsubps_avx(local_780,auVar146);
            auVar21 = vsubps_avx(_local_820,auVar137);
            auVar175 = vsubps_avx(local_640,auVar135);
            auVar235 = ZEXT3264(auVar175);
            auVar199._0_4_ = auVar203._0_4_ * local_780._0_4_;
            auVar199._4_4_ = auVar203._4_4_ * local_780._4_4_;
            auVar199._8_4_ = auVar203._8_4_ * local_780._8_4_;
            auVar199._12_4_ = auVar203._12_4_ * local_780._12_4_;
            auVar199._16_4_ = auVar203._16_4_ * local_780._16_4_;
            auVar199._20_4_ = auVar203._20_4_ * local_780._20_4_;
            auVar199._24_4_ = auVar203._24_4_ * local_780._24_4_;
            auVar199._28_4_ = 0;
            auVar9 = vfmsub231ps_fma(auVar199,local_640,auVar153);
            auVar82._4_4_ = auVar153._4_4_ * local_820._4_4_;
            auVar82._0_4_ = auVar153._0_4_ * local_820._0_4_;
            auVar82._8_4_ = auVar153._8_4_ * local_820._8_4_;
            auVar82._12_4_ = auVar153._12_4_ * local_820._12_4_;
            auVar82._16_4_ = auVar153._16_4_ * local_820._16_4_;
            auVar82._20_4_ = auVar153._20_4_ * local_820._20_4_;
            auVar82._24_4_ = auVar153._24_4_ * local_820._24_4_;
            auVar82._28_4_ = auVar179._28_4_;
            auVar10 = vfmsub231ps_fma(auVar82,local_780,auVar22);
            auVar9 = vfmadd231ps_fma(ZEXT1632(auVar10),ZEXT1632((undefined1  [16])0x0),
                                     ZEXT1632(auVar9));
            auVar200._0_4_ = auVar22._0_4_ * local_640._0_4_;
            auVar200._4_4_ = auVar22._4_4_ * local_640._4_4_;
            auVar200._8_4_ = auVar22._8_4_ * local_640._8_4_;
            auVar200._12_4_ = auVar22._12_4_ * local_640._12_4_;
            auVar200._16_4_ = auVar22._16_4_ * local_640._16_4_;
            auVar200._20_4_ = auVar22._20_4_ * local_640._20_4_;
            auVar200._24_4_ = auVar22._24_4_ * local_640._24_4_;
            auVar200._28_4_ = 0;
            auVar10 = vfmsub231ps_fma(auVar200,_local_820,auVar203);
            auVar10 = vfmadd231ps_fma(ZEXT1632(auVar9),ZEXT1632((undefined1  [16])0x0),
                                      ZEXT1632(auVar10));
            auVar181 = ZEXT1664(auVar10);
            auVar201._0_4_ = auVar175._0_4_ * auVar146._0_4_;
            auVar201._4_4_ = auVar175._4_4_ * auVar146._4_4_;
            auVar201._8_4_ = auVar175._8_4_ * auVar146._8_4_;
            auVar201._12_4_ = auVar175._12_4_ * auVar146._12_4_;
            auVar201._16_4_ = auVar175._16_4_ * auVar146._16_4_;
            auVar201._20_4_ = auVar175._20_4_ * auVar146._20_4_;
            auVar201._24_4_ = auVar175._24_4_ * auVar146._24_4_;
            auVar201._28_4_ = 0;
            auVar9 = vfmsub231ps_fma(auVar201,auVar148,auVar135);
            auVar83._4_4_ = auVar21._4_4_ * auVar135._4_4_;
            auVar83._0_4_ = auVar21._0_4_ * auVar135._0_4_;
            auVar83._8_4_ = auVar21._8_4_ * auVar135._8_4_;
            auVar83._12_4_ = auVar21._12_4_ * auVar135._12_4_;
            auVar83._16_4_ = auVar21._16_4_ * auVar135._16_4_;
            auVar83._20_4_ = auVar21._20_4_ * auVar135._20_4_;
            auVar83._24_4_ = auVar21._24_4_ * auVar135._24_4_;
            auVar83._28_4_ = local_780._28_4_;
            auVar129 = vfmsub231ps_fma(auVar83,auVar137,auVar175);
            auVar84._4_4_ = auVar148._4_4_ * auVar137._4_4_;
            auVar84._0_4_ = auVar148._0_4_ * auVar137._0_4_;
            auVar84._8_4_ = auVar148._8_4_ * auVar137._8_4_;
            auVar84._12_4_ = auVar148._12_4_ * auVar137._12_4_;
            auVar84._16_4_ = auVar148._16_4_ * auVar137._16_4_;
            auVar84._20_4_ = auVar148._20_4_ * auVar137._20_4_;
            auVar84._24_4_ = auVar148._24_4_ * auVar137._24_4_;
            auVar84._28_4_ = auVar137._28_4_;
            auVar11 = vfmsub231ps_fma(auVar84,auVar21,auVar146);
            auVar137 = ZEXT1632((undefined1  [16])0x0);
            auVar9 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar137,ZEXT1632(auVar9));
            auVar129 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar137,ZEXT1632(auVar129));
            auVar146 = vmaxps_avx(ZEXT1632(auVar10),ZEXT1632(auVar129));
            auVar146 = vcmpps_avx(auVar146,auVar137,2);
            auVar9 = vpackssdw_avx(auVar146._0_16_,auVar146._16_16_);
            auVar8 = vpand_avx(auVar9,auVar8);
            auVar146 = vpmovsxwd_avx2(auVar8);
            if ((((((((auVar146 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar146 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar146 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar146 >> 0x7f,0) == '\0') &&
                  (auVar146 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar146 >> 0xbf,0) == '\0') &&
                (auVar146 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar146[0x1f]) {
LAB_019604e5:
              auVar187._8_8_ = uStack_518;
              auVar187._0_8_ = local_520;
              auVar187._16_8_ = uStack_510;
              auVar187._24_8_ = uStack_508;
              auVar218 = ZEXT3264(local_4e0);
            }
            else {
              auVar85._4_4_ = auVar22._4_4_ * auVar175._4_4_;
              auVar85._0_4_ = auVar22._0_4_ * auVar175._0_4_;
              auVar85._8_4_ = auVar22._8_4_ * auVar175._8_4_;
              auVar85._12_4_ = auVar22._12_4_ * auVar175._12_4_;
              auVar85._16_4_ = auVar22._16_4_ * auVar175._16_4_;
              auVar85._20_4_ = auVar22._20_4_ * auVar175._20_4_;
              auVar85._24_4_ = auVar22._24_4_ * auVar175._24_4_;
              auVar85._28_4_ = auVar146._28_4_;
              auVar13 = vfmsub231ps_fma(auVar85,auVar21,auVar203);
              auVar204._0_4_ = auVar203._0_4_ * auVar148._0_4_;
              auVar204._4_4_ = auVar203._4_4_ * auVar148._4_4_;
              auVar204._8_4_ = auVar203._8_4_ * auVar148._8_4_;
              auVar204._12_4_ = auVar203._12_4_ * auVar148._12_4_;
              auVar204._16_4_ = auVar203._16_4_ * auVar148._16_4_;
              auVar204._20_4_ = auVar203._20_4_ * auVar148._20_4_;
              auVar204._24_4_ = auVar203._24_4_ * auVar148._24_4_;
              auVar204._28_4_ = 0;
              auVar12 = vfmsub231ps_fma(auVar204,auVar153,auVar175);
              auVar86._4_4_ = auVar153._4_4_ * auVar21._4_4_;
              auVar86._0_4_ = auVar153._0_4_ * auVar21._0_4_;
              auVar86._8_4_ = auVar153._8_4_ * auVar21._8_4_;
              auVar86._12_4_ = auVar153._12_4_ * auVar21._12_4_;
              auVar86._16_4_ = auVar153._16_4_ * auVar21._16_4_;
              auVar86._20_4_ = auVar153._20_4_ * auVar21._20_4_;
              auVar86._24_4_ = auVar153._24_4_ * auVar21._24_4_;
              auVar86._28_4_ = auVar21._28_4_;
              auVar14 = vfmsub231ps_fma(auVar86,auVar148,auVar22);
              auVar9 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar12),ZEXT1632(auVar14));
              auVar11 = vfmadd231ps_fma(ZEXT1632(auVar9),ZEXT1632(auVar13),auVar137);
              auVar146 = vrcpps_avx(ZEXT1632(auVar11));
              auVar227._8_4_ = 0x3f800000;
              auVar227._0_8_ = &DAT_3f8000003f800000;
              auVar227._12_4_ = 0x3f800000;
              auVar227._16_4_ = 0x3f800000;
              auVar227._20_4_ = 0x3f800000;
              auVar227._24_4_ = 0x3f800000;
              auVar227._28_4_ = 0x3f800000;
              auVar9 = vfnmadd213ps_fma(auVar146,ZEXT1632(auVar11),auVar227);
              auVar9 = vfmadd132ps_fma(ZEXT1632(auVar9),auVar146,auVar146);
              auVar87._4_4_ = auVar14._4_4_ * local_640._4_4_;
              auVar87._0_4_ = auVar14._0_4_ * local_640._0_4_;
              auVar87._8_4_ = auVar14._8_4_ * local_640._8_4_;
              auVar87._12_4_ = auVar14._12_4_ * local_640._12_4_;
              auVar87._16_4_ = local_640._16_4_ * 0.0;
              auVar87._20_4_ = local_640._20_4_ * 0.0;
              auVar87._24_4_ = local_640._24_4_ * 0.0;
              auVar87._28_4_ = local_820._28_4_;
              auVar12 = vfmadd231ps_fma(auVar87,ZEXT1632(auVar12),_local_820);
              auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),ZEXT1632(auVar13),local_780);
              fVar140 = auVar9._0_4_;
              fVar141 = auVar9._4_4_;
              fVar142 = auVar9._8_4_;
              fVar143 = auVar9._12_4_;
              auVar135 = ZEXT1632(CONCAT412(fVar143 * auVar12._12_4_,
                                            CONCAT48(fVar142 * auVar12._8_4_,
                                                     CONCAT44(fVar141 * auVar12._4_4_,
                                                              fVar140 * auVar12._0_4_))));
              fVar163 = (ray->super_RayK<1>).tfar;
              auVar186._4_4_ = fVar163;
              auVar186._0_4_ = fVar163;
              auVar186._8_4_ = fVar163;
              auVar186._12_4_ = fVar163;
              auVar186._16_4_ = fVar163;
              auVar186._20_4_ = fVar163;
              auVar186._24_4_ = fVar163;
              auVar186._28_4_ = fVar163;
              auVar112._4_4_ = uStack_19c;
              auVar112._0_4_ = local_1a0;
              auVar112._8_4_ = uStack_198;
              auVar112._12_4_ = uStack_194;
              auVar112._16_4_ = uStack_190;
              auVar112._20_4_ = uStack_18c;
              auVar112._24_4_ = uStack_188;
              auVar112._28_4_ = uStack_184;
              auVar146 = vcmpps_avx(auVar112,auVar135,2);
              auVar137 = vcmpps_avx(auVar135,auVar186,2);
              auVar146 = vandps_avx(auVar137,auVar146);
              auVar9 = vpackssdw_avx(auVar146._0_16_,auVar146._16_16_);
              auVar8 = vpand_avx(auVar8,auVar9);
              auVar146 = vpmovsxwd_avx2(auVar8);
              if ((((((((auVar146 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar146 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar146 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar146 >> 0x7f,0) == '\0') &&
                    (auVar146 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar146 >> 0xbf,0) == '\0') &&
                  (auVar146 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar146[0x1f]) goto LAB_019604e5;
              auVar146 = vcmpps_avx(ZEXT1632(auVar11),ZEXT832(0) << 0x20,4);
              auVar9 = vpackssdw_avx(auVar146._0_16_,auVar146._16_16_);
              auVar8 = vpand_avx(auVar8,auVar9);
              auVar146 = vpmovsxwd_avx2(auVar8);
              auVar187._8_8_ = uStack_518;
              auVar187._0_8_ = local_520;
              auVar187._16_8_ = uStack_510;
              auVar187._24_8_ = uStack_508;
              auVar218 = ZEXT3264(local_4e0);
              if ((((((((auVar146 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar146 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar146 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar146 >> 0x7f,0) != '\0') ||
                    (auVar146 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar146 >> 0xbf,0) != '\0') ||
                  (auVar146 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar146[0x1f] < '\0') {
                auVar153 = ZEXT1632(CONCAT412(fVar143 * auVar10._12_4_,
                                              CONCAT48(fVar142 * auVar10._8_4_,
                                                       CONCAT44(fVar141 * auVar10._4_4_,
                                                                fVar140 * auVar10._0_4_))));
                auVar88._28_4_ = SUB84(uStack_508,4);
                auVar88._0_28_ =
                     ZEXT1628(CONCAT412(fVar143 * auVar129._12_4_,
                                        CONCAT48(fVar142 * auVar129._8_4_,
                                                 CONCAT44(fVar141 * auVar129._4_4_,
                                                          fVar140 * auVar129._0_4_))));
                auVar210._8_4_ = 0x3f800000;
                auVar210._0_8_ = &DAT_3f8000003f800000;
                auVar210._12_4_ = 0x3f800000;
                auVar210._16_4_ = 0x3f800000;
                auVar210._20_4_ = 0x3f800000;
                auVar210._24_4_ = 0x3f800000;
                auVar210._28_4_ = 0x3f800000;
                auVar137 = vsubps_avx(auVar210,auVar153);
                local_160 = vblendvps_avx(auVar137,auVar153,auVar23);
                auVar137 = vsubps_avx(auVar210,auVar88);
                local_2c0 = vblendvps_avx(auVar137,auVar88,auVar23);
                auVar181 = ZEXT3264(local_2c0);
                auVar218 = ZEXT3264(auVar135);
                auVar187 = auVar146;
              }
            }
            auVar251 = ZEXT3264(local_760);
            auVar222 = ZEXT3264(local_720);
            local_4e0 = auVar218._0_32_;
            if ((((((((auVar187 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar187 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar187 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar187 >> 0x7f,0) == '\0') &&
                  (auVar187 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar187 >> 0xbf,0) == '\0') &&
                (auVar187 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar187[0x1f]) goto LAB_019601e1;
            auVar146 = vsubps_avx(local_480,auVar156);
            auVar8 = vfmadd213ps_fma(auVar146,local_160,auVar156);
            fVar163 = local_7b8->depth_scale;
            auVar89._4_4_ = (auVar8._4_4_ + auVar8._4_4_) * fVar163;
            auVar89._0_4_ = (auVar8._0_4_ + auVar8._0_4_) * fVar163;
            auVar89._8_4_ = (auVar8._8_4_ + auVar8._8_4_) * fVar163;
            auVar89._12_4_ = (auVar8._12_4_ + auVar8._12_4_) * fVar163;
            auVar89._16_4_ = fVar163 * 0.0;
            auVar89._20_4_ = fVar163 * 0.0;
            auVar89._24_4_ = fVar163 * 0.0;
            auVar89._28_4_ = fVar163;
            auVar146 = vcmpps_avx(local_4e0,auVar89,6);
            auVar137 = auVar187 & auVar146;
            auVar211 = ZEXT3264(local_700);
            if ((((((((auVar137 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar137 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar137 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar137 >> 0x7f,0) != '\0') ||
                  (auVar137 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar137 >> 0xbf,0) != '\0') ||
                (auVar137 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar137[0x1f] < '\0') {
              auVar146 = vandps_avx(auVar146,auVar187);
              auVar157._8_4_ = 0xbf800000;
              auVar157._0_8_ = 0xbf800000bf800000;
              auVar157._12_4_ = 0xbf800000;
              auVar157._16_4_ = 0xbf800000;
              auVar157._20_4_ = 0xbf800000;
              auVar157._24_4_ = 0xbf800000;
              auVar157._28_4_ = 0xbf800000;
              auVar180._8_4_ = 0x40000000;
              auVar180._0_8_ = 0x4000000040000000;
              auVar180._12_4_ = 0x40000000;
              auVar180._16_4_ = 0x40000000;
              auVar180._20_4_ = 0x40000000;
              auVar180._24_4_ = 0x40000000;
              auVar180._28_4_ = 0x40000000;
              auVar181 = ZEXT3264(auVar180);
              auVar8 = vfmadd213ps_fma(local_2c0,auVar180,auVar157);
              local_400 = local_160;
              local_2c0 = ZEXT1632(auVar8);
              auVar137 = local_2c0;
              local_3e0 = ZEXT1632(auVar8);
              local_3c0 = local_4e0;
              local_39c = iVar17;
              local_390 = local_7d0._0_8_;
              uStack_388 = local_7d0._8_8_;
              local_380 = local_6a0._0_8_;
              uStack_378 = local_6a0._8_8_;
              local_370 = local_6b0._0_8_;
              uStack_368 = local_6b0._8_8_;
              local_360 = local_6c0;
              uStack_358 = uStack_6b8;
              local_340 = auVar146;
              pGVar123 = (context->scene->geometries).items[local_828].ptr;
              local_2c0 = auVar137;
              if ((pGVar123->mask & (ray->super_RayK<1>).mask) != 0) {
                local_560 = auVar146;
                auVar235 = ZEXT864(0);
                fVar163 = (float)local_3a0;
                local_320[0] = (fVar163 + local_160._0_4_ + 0.0) * local_1c0;
                local_320[1] = (fVar163 + local_160._4_4_ + 1.0) * fStack_1bc;
                local_320[2] = (fVar163 + local_160._8_4_ + 2.0) * fStack_1b8;
                local_320[3] = (fVar163 + local_160._12_4_ + 3.0) * fStack_1b4;
                fStack_310 = (fVar163 + local_160._16_4_ + 4.0) * fStack_1b0;
                fStack_30c = (fVar163 + local_160._20_4_ + 5.0) * fStack_1ac;
                fStack_308 = (fVar163 + local_160._24_4_ + 6.0) * fStack_1a8;
                fStack_304 = fVar163 + local_160._28_4_ + 7.0;
                local_2c0._0_8_ = auVar8._0_8_;
                local_2c0._8_8_ = auVar8._8_8_;
                local_300 = local_2c0._0_8_;
                uStack_2f8 = local_2c0._8_8_;
                uStack_2f0 = 0;
                uStack_2e8 = 0;
                local_2e0 = local_4e0;
                auVar158._8_4_ = 0x7f800000;
                auVar158._0_8_ = 0x7f8000007f800000;
                auVar158._12_4_ = 0x7f800000;
                auVar158._16_4_ = 0x7f800000;
                auVar158._20_4_ = 0x7f800000;
                auVar158._24_4_ = 0x7f800000;
                auVar158._28_4_ = 0x7f800000;
                auVar137 = vblendvps_avx(auVar158,local_4e0,auVar146);
                auVar135 = vshufps_avx(auVar137,auVar137,0xb1);
                auVar135 = vminps_avx(auVar137,auVar135);
                auVar153 = vshufpd_avx(auVar135,auVar135,5);
                auVar135 = vminps_avx(auVar135,auVar153);
                auVar153 = vpermpd_avx2(auVar135,0x4e);
                auVar135 = vminps_avx(auVar135,auVar153);
                auVar137 = vcmpps_avx(auVar137,auVar135,0);
                auVar135 = auVar146 & auVar137;
                if ((((((((auVar135 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar135 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar135 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar135 >> 0x7f,0) != '\0') ||
                      (auVar135 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar135 >> 0xbf,0) != '\0') ||
                    (auVar135 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar135[0x1f] < '\0') {
                  auVar146 = vandps_avx(auVar137,auVar146);
                }
                uVar117 = vmovmskps_avx(auVar146);
                uVar119 = 0;
                for (; (uVar117 & 1) == 0; uVar117 = uVar117 >> 1 | 0x80000000) {
                  uVar119 = uVar119 + 1;
                }
                uVar118 = (ulong)uVar119;
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar123->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  fVar163 = local_320[uVar118];
                  fVar140 = *(float *)((long)&local_300 + uVar118 * 4);
                  fVar141 = 1.0 - fVar163;
                  auVar191 = ZEXT416((uint)(fVar163 * fVar141 * 4.0));
                  auVar8 = vfnmsub213ss_fma(ZEXT416((uint)fVar163),ZEXT416((uint)fVar163),auVar191);
                  auVar191 = vfmadd213ss_fma(ZEXT416((uint)fVar141),ZEXT416((uint)fVar141),auVar191)
                  ;
                  fVar141 = fVar141 * -fVar141 * 0.5;
                  fVar142 = auVar8._0_4_ * 0.5;
                  fVar143 = auVar191._0_4_ * 0.5;
                  fVar144 = fVar163 * fVar163 * 0.5;
                  auVar192._0_4_ = fVar144 * (float)local_6c0._0_4_;
                  auVar192._4_4_ = fVar144 * (float)local_6c0._4_4_;
                  auVar192._8_4_ = fVar144 * (float)uStack_6b8;
                  auVar192._12_4_ = fVar144 * uStack_6b8._4_4_;
                  auVar169._4_4_ = fVar143;
                  auVar169._0_4_ = fVar143;
                  auVar169._8_4_ = fVar143;
                  auVar169._12_4_ = fVar143;
                  auVar191 = vfmadd132ps_fma(auVar169,auVar192,local_6b0);
                  auVar193._4_4_ = fVar142;
                  auVar193._0_4_ = fVar142;
                  auVar193._8_4_ = fVar142;
                  auVar193._12_4_ = fVar142;
                  auVar191 = vfmadd132ps_fma(auVar193,auVar191,local_6a0);
                  auVar170._4_4_ = fVar141;
                  auVar170._0_4_ = fVar141;
                  auVar170._8_4_ = fVar141;
                  auVar170._12_4_ = fVar141;
                  auVar191 = vfmadd132ps_fma(auVar170,auVar191,local_7d0);
                  auVar181 = ZEXT1664(auVar191);
                  (ray->super_RayK<1>).tfar = *(float *)(local_2e0 + uVar118 * 4);
                  uVar126 = vmovlps_avx(auVar191);
                  *(undefined8 *)&(ray->Ng).field_0 = uVar126;
                  fVar141 = (float)vextractps_avx(auVar191,2);
                  (ray->Ng).field_0.field_0.z = fVar141;
                  ray->u = fVar163;
                  ray->v = fVar140;
                  ray->primID = (uint)local_7d8;
                  ray->geomID = (uint)local_828;
                  ray->instID[0] = context->user->instID[0];
                  ray->instPrimID[0] = context->user->instPrimID[0];
                }
                else {
                  local_780._0_16_ = local_6a0;
                  local_640._0_16_ = local_6b0;
                  _local_5e0 = ZEXT1632(_local_6c0);
                  local_660 = ZEXT1632(CONCAT88(auVar191._8_8_,pGVar123));
                  _local_240 = auVar24;
                  do {
                    local_684 = local_320[uVar118];
                    local_680 = *(undefined4 *)((long)&local_300 + uVar118 * 4);
                    local_820._0_4_ = (ray->super_RayK<1>).tfar;
                    local_800._0_8_ = uVar118;
                    (ray->super_RayK<1>).tfar = *(float *)(local_2e0 + uVar118 * 4);
                    local_7b0.context = context->user;
                    fVar163 = 1.0 - local_684;
                    auVar191 = ZEXT416((uint)(local_684 * fVar163 * 4.0));
                    auVar8 = vfnmsub213ss_fma(ZEXT416((uint)local_684),ZEXT416((uint)local_684),
                                              auVar191);
                    auVar191 = vfmadd213ss_fma(ZEXT416((uint)fVar163),ZEXT416((uint)fVar163),
                                               auVar191);
                    fVar163 = fVar163 * -fVar163 * 0.5;
                    fVar140 = auVar8._0_4_ * 0.5;
                    fVar141 = auVar191._0_4_ * 0.5;
                    fVar142 = local_684 * local_684 * 0.5;
                    auVar194._0_4_ = fVar142 * (float)local_5e0._0_4_;
                    auVar194._4_4_ = fVar142 * (float)local_5e0._4_4_;
                    auVar194._8_4_ = fVar142 * fStack_5d8;
                    auVar194._12_4_ = fVar142 * fStack_5d4;
                    auVar171._4_4_ = fVar141;
                    auVar171._0_4_ = fVar141;
                    auVar171._8_4_ = fVar141;
                    auVar171._12_4_ = fVar141;
                    auVar191 = vfmadd132ps_fma(auVar171,auVar194,local_640._0_16_);
                    auVar195._4_4_ = fVar140;
                    auVar195._0_4_ = fVar140;
                    auVar195._8_4_ = fVar140;
                    auVar195._12_4_ = fVar140;
                    auVar191 = vfmadd132ps_fma(auVar195,auVar191,local_780._0_16_);
                    auVar172._4_4_ = fVar163;
                    auVar172._0_4_ = fVar163;
                    auVar172._8_4_ = fVar163;
                    auVar172._12_4_ = fVar163;
                    auVar191 = vfmadd132ps_fma(auVar172,auVar191,local_7d0);
                    local_690 = vmovlps_avx(auVar191);
                    local_688 = vextractps_avx(auVar191,2);
                    local_67c = (int)local_7d8;
                    local_678 = (int)local_828;
                    local_674 = (local_7b0.context)->instID[0];
                    local_670 = (local_7b0.context)->instPrimID[0];
                    local_82c = -1;
                    local_7b0.valid = &local_82c;
                    local_7b0.geometryUserPtr = pGVar123->userPtr;
                    local_7b0.ray = (RTCRayN *)ray;
                    local_7b0.hit = (RTCHitN *)&local_690;
                    local_7b0.N = 1;
                    if (pGVar123->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_0196072b:
                      p_Var20 = context->args->filter;
                      if (p_Var20 != (RTCFilterFunctionN)0x0) {
                        if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                           (((pGVar123->field_8).field_0x2 & 0x40) != 0)) {
                          auVar235 = ZEXT1664(auVar235._0_16_);
                          (*p_Var20)(&local_7b0);
                          pGVar123 = (Geometry *)local_660._0_8_;
                        }
                        auVar218 = ZEXT3264(local_4e0);
                        auVar222 = ZEXT3264(local_720);
                        auVar251 = ZEXT3264(local_760);
                        auVar211 = ZEXT3264(local_700);
                        fVar223 = local_6e0;
                        fVar161 = fStack_6dc;
                        fVar237 = fStack_6d8;
                        fVar239 = fStack_6d4;
                        fVar240 = fStack_6d0;
                        fVar241 = fStack_6cc;
                        fVar242 = fStack_6c8;
                        fVar162 = (float)local_740;
                        fVar182 = local_740._4_4_;
                        fVar244 = (float)uStack_738;
                        fVar246 = uStack_738._4_4_;
                        fVar243 = (float)uStack_730;
                        fVar245 = uStack_730._4_4_;
                        fVar247 = (float)uStack_728;
                        fVar248 = uStack_728._4_4_;
                        if (*local_7b0.valid == 0) goto LAB_0196080a;
                      }
                      (((Vec3f *)((long)local_7b0.ray + 0x30))->field_0).components[0] =
                           *(float *)local_7b0.hit;
                      (((Vec3f *)((long)local_7b0.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_7b0.hit + 4);
                      (((Vec3f *)((long)local_7b0.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_7b0.hit + 8);
                      *(float *)((long)local_7b0.ray + 0x3c) = *(float *)(local_7b0.hit + 0xc);
                      *(float *)((long)local_7b0.ray + 0x40) = *(float *)(local_7b0.hit + 0x10);
                      *(float *)((long)local_7b0.ray + 0x44) = *(float *)(local_7b0.hit + 0x14);
                      *(float *)((long)local_7b0.ray + 0x48) = *(float *)(local_7b0.hit + 0x18);
                      *(float *)((long)local_7b0.ray + 0x4c) = *(float *)(local_7b0.hit + 0x1c);
                      *(float *)((long)local_7b0.ray + 0x50) = *(float *)(local_7b0.hit + 0x20);
                    }
                    else {
                      auVar235 = ZEXT1664(auVar235._0_16_);
                      (*pGVar123->intersectionFilterN)(&local_7b0);
                      auVar211 = ZEXT3264(local_700);
                      auVar251 = ZEXT3264(local_760);
                      auVar222 = ZEXT3264(local_720);
                      auVar218 = ZEXT3264(local_4e0);
                      pGVar123 = (Geometry *)local_660._0_8_;
                      fVar223 = local_6e0;
                      fVar161 = fStack_6dc;
                      fVar237 = fStack_6d8;
                      fVar239 = fStack_6d4;
                      fVar240 = fStack_6d0;
                      fVar241 = fStack_6cc;
                      fVar242 = fStack_6c8;
                      fVar162 = (float)local_740;
                      fVar182 = local_740._4_4_;
                      fVar244 = (float)uStack_738;
                      fVar246 = uStack_738._4_4_;
                      fVar243 = (float)uStack_730;
                      fVar245 = uStack_730._4_4_;
                      fVar247 = (float)uStack_728;
                      fVar248 = uStack_728._4_4_;
                      if (*local_7b0.valid != 0) goto LAB_0196072b;
LAB_0196080a:
                      (ray->super_RayK<1>).tfar = (float)local_820._0_4_;
                      fVar223 = local_6e0;
                      fVar161 = fStack_6dc;
                      fVar237 = fStack_6d8;
                      fVar239 = fStack_6d4;
                      fVar240 = fStack_6d0;
                      fVar241 = fStack_6cc;
                      fVar242 = fStack_6c8;
                    }
                    *(undefined4 *)(local_560 + local_800._0_8_ * 4) = 0;
                    auVar135 = local_560;
                    fVar163 = (ray->super_RayK<1>).tfar;
                    auVar138._4_4_ = fVar163;
                    auVar138._0_4_ = fVar163;
                    auVar138._8_4_ = fVar163;
                    auVar138._12_4_ = fVar163;
                    auVar138._16_4_ = fVar163;
                    auVar138._20_4_ = fVar163;
                    auVar138._24_4_ = fVar163;
                    auVar138._28_4_ = fVar163;
                    auVar137 = vcmpps_avx(auVar218._0_32_,auVar138,2);
                    auVar146 = vandps_avx(auVar137,local_560);
                    local_560 = auVar146;
                    auVar137 = auVar135 & auVar137;
                    bVar98 = (auVar137 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                    bVar99 = (auVar137 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                    bVar97 = (auVar137 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                    bVar96 = SUB321(auVar137 >> 0x7f,0) != '\0';
                    bVar95 = (auVar137 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                    bVar94 = SUB321(auVar137 >> 0xbf,0) != '\0';
                    bVar92 = (auVar137 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                    bVar90 = auVar137[0x1f] < '\0';
                    uVar118 = local_800._0_8_;
                    if (((((((bVar98 || bVar99) || bVar97) || bVar96) || bVar95) || bVar94) ||
                        bVar92) || bVar90) {
                      auVar159._8_4_ = 0x7f800000;
                      auVar159._0_8_ = 0x7f8000007f800000;
                      auVar159._12_4_ = 0x7f800000;
                      auVar159._16_4_ = 0x7f800000;
                      auVar159._20_4_ = 0x7f800000;
                      auVar159._24_4_ = 0x7f800000;
                      auVar159._28_4_ = 0x7f800000;
                      auVar137 = vblendvps_avx(auVar159,auVar218._0_32_,auVar146);
                      auVar135 = vshufps_avx(auVar137,auVar137,0xb1);
                      auVar135 = vminps_avx(auVar137,auVar135);
                      auVar153 = vshufpd_avx(auVar135,auVar135,5);
                      auVar135 = vminps_avx(auVar135,auVar153);
                      auVar153 = vpermpd_avx2(auVar135,0x4e);
                      auVar135 = vminps_avx(auVar135,auVar153);
                      auVar137 = vcmpps_avx(auVar137,auVar135,0);
                      auVar153 = auVar146 & auVar137;
                      if ((((((((auVar153 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar153 >> 0x3f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                              (auVar153 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || SUB321(auVar153 >> 0x7f,0) != '\0') ||
                            (auVar153 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar153 >> 0xbf,0) != '\0') ||
                          (auVar153 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar153[0x1f] < '\0') {
                        auVar146 = vandps_avx(auVar137,auVar146);
                      }
                      uVar117 = vmovmskps_avx(auVar146);
                      uVar119 = 0;
                      for (; (uVar117 & 1) == 0; uVar117 = uVar117 >> 1 | 0x80000000) {
                        uVar119 = uVar119 + 1;
                      }
                      uVar118 = (ulong)uVar119;
                    }
                    auVar181 = ZEXT3264(auVar135);
                  } while (((((((bVar98 || bVar99) || bVar97) || bVar96) || bVar95) || bVar94) ||
                           bVar92) || bVar90);
                }
              }
            }
          }
          lVar120 = lVar120 + 8;
        } while ((int)lVar120 < iVar17);
      }
      fVar163 = (ray->super_RayK<1>).tfar;
      auVar136._4_4_ = fVar163;
      auVar136._0_4_ = fVar163;
      auVar136._8_4_ = fVar163;
      auVar136._12_4_ = fVar163;
      auVar136._16_4_ = fVar163;
      auVar136._20_4_ = fVar163;
      auVar136._24_4_ = fVar163;
      auVar136._28_4_ = fVar163;
      auVar146 = vcmpps_avx(local_80,auVar136,2);
      uVar119 = vmovmskps_avx(auVar146);
      uVar115 = uVar115 & uVar115 + 0xff & uVar119;
    } while (uVar115 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time());

          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }